

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

fdb_compact_decision
cb_snapshot(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc,
           uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  bool bVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  int iVar3;
  fdb_compact_decision extraout_EAX;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  ulong extraout_RAX;
  size_t sVar7;
  size_t sVar8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 handle_00;
  __atomic_base<unsigned_long> metalen;
  uint extraout_EDX;
  long extraout_RDX;
  fdb_kvs_handle *pfVar9;
  code *pcVar10;
  fdb_doc *ptr_handle;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar11;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 fconfig;
  timeval *__tv;
  fdb_config *fconfig_00;
  fdb_kvs_handle **ppfVar12;
  uint uVar13;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *__s;
  long lVar15;
  char *__s_00;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar16;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar17;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar18;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar19;
  uint uVar20;
  fdb_file_handle *pfVar21;
  fdb_doc **ppfVar22;
  fdb_kvs_handle **ppfVar23;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 unaff_R13;
  btree *doc_00;
  long lVar24;
  char *pcVar25;
  fdb_kvs_config *config;
  char *pcVar26;
  uint *puVar27;
  fdb_config *fconfig_01;
  fdb_kvs_handle **ppfVar28;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar29;
  char *pcVar30;
  fdb_doc **doc_01;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 doc_02;
  fdb_kvs_handle *pfVar31;
  fdb_kvs_handle *pfStack_5270;
  fdb_kvs_handle *pfStack_5268;
  fdb_file_handle *pfStack_5260;
  fdb_iterator *pfStack_5258;
  fdb_doc *pfStack_5250;
  fdb_kvs_handle *pfStack_5248;
  timeval tStack_5240;
  fdb_kvs_config fStack_5230;
  fdb_config fStack_5218;
  fdb_config *pfStack_5120;
  fdb_kvs_handle *pfStack_5118;
  fdb_kvs_handle *pfStack_5110;
  fdb_file_handle *pfStack_5108;
  fdb_kvs_handle *pfStack_5100;
  char acStack_50f7 [15];
  filemgr *pfStack_50e8;
  docio_handle *pdStack_50e0;
  btreeblk_handle *pbStack_50d8;
  size_t sStack_50d0;
  filemgr *pfStack_50c8;
  docio_handle *pdStack_50c0;
  btreeblk_handle *pbStack_50b8;
  timeval tStack_50b0;
  undefined1 auStack_50a0 [76];
  uint uStack_5054;
  char *pcStack_4f60;
  atomic<unsigned_long> aStack_4f58;
  btree *pbStack_4f50;
  fdb_kvs_handle *pfStack_4f48;
  fdb_kvs_handle *pfStack_4f40;
  code *pcStack_4f38;
  uint uStack_4f24;
  fdb_txn *pfStack_4f20;
  fdb_kvs_handle *pfStack_4f18;
  fdb_iterator *pfStack_4f10;
  fdb_snapshot_info_t *pfStack_4f08;
  int iStack_4efc;
  fdb_kvs_handle *pfStack_4ef8;
  fdb_kvs_handle *apfStack_4ef0 [3];
  uint64_t uStack_4ed8;
  fdb_kvs_config fStack_4ed0;
  char acStack_4eb8 [8];
  timeval tStack_4eb0;
  char acStack_4ea0 [256];
  btree bStack_4da0;
  char acStack_4d50 [256];
  char acStack_4c50 [256];
  fdb_config fStack_4b50;
  fdb_kvs_handle **ppfStack_4a58;
  fdb_kvs_handle **ppfStack_4a50;
  fdb_kvs_handle *pfStack_4a48;
  fdb_kvs_handle **ppfStack_4a40;
  fdb_kvs_handle *pfStack_4a38;
  code *pcStack_4a30;
  fdb_kvs_handle **ppfStack_4a28;
  fdb_kvs_handle *pfStack_4a20;
  fdb_kvs_handle *apfStack_4a18 [9];
  fdb_kvs_config fStack_49d0;
  timeval tStack_49b8;
  fdb_kvs_handle *apfStack_49a8 [33];
  fdb_config fStack_48a0;
  fdb_kvs_handle *apfStack_47a8 [32];
  fdb_kvs_handle *apfStack_46a8 [32];
  fdb_kvs_handle afStack_45a8 [15];
  fdb_config *pfStack_25a0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2598;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2590;
  fdb_config *pfStack_2588;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2580;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2578;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2568;
  fdb_file_handle *pfStack_2560;
  fdb_iterator *pfStack_2558;
  fdb_doc *pfStack_2550;
  fdb_kvs_handle *pfStack_2548;
  undefined1 auStack_253f [15];
  timeval tStack_2530;
  undefined1 auStack_2520 [72];
  fdb_config fStack_24d8;
  timeval *ptStack_23e0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_23d8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_23d0;
  fdb_config *pfStack_23c8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_23c0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_23b0;
  fdb_file_handle *pfStack_23a8;
  undefined4 uStack_239c;
  pthread_t pStack_2398;
  char acStack_238f [15];
  void *pvStack_2380;
  char *pcStack_2378;
  fdb_config *pfStack_2370;
  uint64_t uStack_2368;
  timeval tStack_2360;
  undefined1 auStack_2350 [16];
  uint64_t uStack_2340;
  fdb_config fStack_2258;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2158;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2150;
  uint *puStack_2148;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2140;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2138;
  timeval tStack_2128;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2118;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2110;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2100;
  fdb_kvs_handle *pfStack_20f8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_20f0;
  fdb_file_handle *pfStack_20e8;
  uint uStack_20dc;
  fdb_kvs_config afStack_20d8 [2];
  timeval tStack_2098;
  fdb_kvs_config fStack_2088;
  fdb_kvs_info fStack_2068;
  undefined1 auStack_2038 [32];
  undefined1 uStack_2018;
  undefined1 uStack_200a;
  undefined8 uStack_2000;
  code *pcStack_1fe0;
  undefined4 uStack_1fd8;
  uint *puStack_1fd0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1f40;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1f38;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1f30;
  hbtrie_func_readkey *phStack_1f28;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1f20;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1f18;
  fdb_file_handle *pfStack_1f08;
  int iStack_1efc;
  fdb_kvs_handle *pfStack_1ef8;
  fdb_kvs_handle *pfStack_1ef0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1ee8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_1ee0 [5];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1eb8;
  char acStack_1eb0 [8];
  fdb_kvs_config fStack_1ea8;
  fdb_kvs_info fStack_1e90;
  timeval tStack_1e60;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_1e50 [5];
  btree *apbStack_1e28 [5];
  btree *apbStack_1e00 [5];
  btree *apbStack_1dd8 [4];
  fdb_doc *pfStack_1db8;
  char acStack_1db0 [256];
  char acStack_1cb0 [256];
  char acStack_1bb0 [256];
  fdb_config fStack_1ab0;
  fdb_doc *pfStack_19b8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_19b0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_19a8;
  fdb_kvs_config *pfStack_19a0;
  fdb_doc **ppfStack_1998;
  code *pcStack_1990;
  undefined1 auStack_1978 [72];
  fdb_kvs_config fStack_1930;
  fdb_doc afStack_1918 [3];
  char acStack_1818 [256];
  char acStack_1718 [264];
  fdb_config fStack_1610;
  fdb_doc *pfStack_1518;
  size_t *psStack_1510;
  fdb_doc *apfStack_1068 [151];
  fdb_kvs_handle *pfStack_bb0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_ba8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_ba0;
  char *pcStack_b98;
  char *pcStack_b90;
  code *pcStack_b88;
  fdb_kvs_handle *pfStack_b78;
  int iStack_b6c;
  fdb_kvs_handle *pfStack_b68;
  undefined1 auStack_b60 [232];
  char acStack_a78 [8];
  char acStack_a70 [64];
  timeval tStack_a30;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_a20 [5];
  btree *apbStack_9f8 [5];
  btree *apbStack_9d0 [5];
  btree *apbStack_9a8 [5];
  fdb_config fStack_980;
  fdb_kvs_info *pfStack_888;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_880;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_878;
  fdb_kvs_handle **ppfStack_870;
  fdb_kvs_handle **ppfStack_868;
  code *pcStack_860;
  fdb_file_handle *pfStack_848;
  uint uStack_83c;
  fdb_kvs_handle *apfStack_838 [4];
  fdb_kvs_info fStack_818;
  fdb_kvs_config fStack_7e8;
  char acStack_7d0 [8];
  timeval tStack_7c8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_7b8 [5];
  btree *apbStack_790 [5];
  btree *apbStack_768 [5];
  btree *apbStack_740 [5];
  char acStack_718 [256];
  char acStack_618 [256];
  char acStack_518 [256];
  fdb_config fStack_418;
  fdb_kvs_handle *pfStack_320;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_318;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_310;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_308;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_300;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_2f8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  fdb_kvs_handle *pfStack_2d8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_2d0;
  ulong uStack_2c8;
  fdb_kvs_handle *pfStack_2c0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2b8;
  size_t sStack_2b0;
  fdb_kvs_handle *pfStack_2a8;
  timeval tStack_2a0;
  fdb_kvs_handle fStack_290;
  void *pvStack_58;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar14;
  
  pfVar9 = (fdb_kvs_handle *)&stack0xffffffffffffffd8;
  uVar5 = 0;
  gettimeofday((timeval *)&stack0xffffffffffffffd8,(__timezone_ptr_t)0x0);
  iVar4 = *(int *)((long)ctx + 0x10);
  *(int *)((long)ctx + 0x10) = iVar4 + -1;
  if (iVar4 < 1) {
    return 0;
  }
  if (kv_name == (char *)0x0) {
    _snapshot_check(*ctx,*(int *)((long)ctx + 8),*(int *)((long)ctx + 0xc));
    _snapshot_update_docs(fhandle,(cb_snapshot_args *)ctx);
    _snapshot_check(*ctx,*(int *)((long)ctx + 8),*(int *)((long)ctx + 0xc));
    return 0;
  }
  cb_snapshot();
  pvStack_58 = ctx;
  paVar11 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
  paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c17;
  gettimeofday(&tStack_2a0,(__timezone_ptr_t)0x0);
  uStack_2e4 = (uint)uVar5;
  uVar13 = (int)(((uint)(uVar5 >> 0x1f) & 1) + uStack_2e4) >> 1;
  paVar14 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(ulong)uVar13;
  pfVar31 = &fStack_290;
  paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c39;
  pfStack_2c0 = pfVar9;
  fdb_get_kvs_info(pfVar9,(fdb_kvs_info *)pfVar31);
  uVar5 = (ulong)(int)uVar13;
  uStack_2c8 = uVar5;
  if (fStack_290.kvs_config.custom_cmp != (fdb_custom_cmp_variable)((long)(int)extraout_EDX * uVar5)
     ) {
    paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119db5;
    _snapshot_check();
    uVar5 = extraout_RAX;
  }
  paStack_2d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(ulong)extraout_EDX;
  if ((int)extraout_EDX < 1) {
    paStack_2d0 = paVar11;
  }
  handle_00.seqtree = (btree *)0x0;
  while( true ) {
    paVar29 = paStack_2d0;
    if ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)handle_00.seqtree == paStack_2d0) {
      return (fdb_compact_decision)uVar5;
    }
    aStack_2b8.seqtree = (btree *)&(handle_00.seqtree)->vsize;
    paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c89;
    pfVar9 = pfStack_2c0;
    fVar2 = fdb_snapshot_open(pfStack_2c0,&pfStack_2d8,(long)aStack_2b8.seqtree * uStack_2c8);
    uVar20 = (uint)pfVar9;
    pfVar9 = pfVar31;
    __s = paVar14;
    paStack_308 = paVar11;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    if (0 < (int)uStack_2e4) {
      uStack_2e0 = handle_00._0_4_;
      uStack_2dc = (uStack_2e0 - ((int)(uStack_2e0 - 1) >> 0x1f)) - 1 | 1;
      uStack_2e0 = uStack_2e0 & 0x7ffffffe;
      paVar29 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
      do {
        iVar4 = (int)paVar29;
        if ((int)uVar13 <= iVar4 &&
            (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)handle_00.seqtree ==
            (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0) break;
        uVar20 = uStack_2dc;
        if (iVar4 < (int)uVar13) {
          uVar20 = uStack_2e0;
        }
        __s = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
              &fStack_290.config.min_block_reuse_filesize;
        paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119cfe;
        sprintf((char *)__s,"key%04d",paVar29);
        unaff_R13.seqtree = (btree *)&fStack_290.trie;
        paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d1c;
        sprintf((char *)unaff_R13.seqtree,"body%04d_update%d",paVar29,(ulong)uVar20);
        pfVar9 = pfStack_2d8;
        paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d29;
        sVar6 = strlen((char *)__s);
        paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d42;
        fVar2 = fdb_get_kv(pfVar9,__s,sVar6 + 1,&pfStack_2a8,&sStack_2b0);
        pfVar31 = pfStack_2a8;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119dbf;
          _snapshot_check();
LAB_00119dbf:
          uVar20 = (int)&fStack_290 + 0x30;
          paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119dcf;
          _snapshot_check();
          paStack_308 = paVar14;
          goto LAB_00119dcf;
        }
        paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d5b;
        iVar3 = bcmp(pfStack_2a8,unaff_R13.seqtree,sStack_2b0);
        pfVar9 = pfVar31;
        if (iVar3 != 0) goto LAB_00119dbf;
        paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d67;
        fdb_free_block(pfVar31);
        paVar29 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(ulong)(iVar4 + 1U);
        paVar11 = paVar14;
      } while (uStack_2e4 != iVar4 + 1U);
    }
    paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d82;
    fVar2 = fdb_kvs_close(pfStack_2d8);
    uVar5 = (ulong)(uint)fVar2;
    handle_00 = aStack_2b8;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d99;
      _snapshot_check();
      return extraout_EAX;
    }
  }
LAB_00119dcf:
  paStack_2f8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)rollback_to_zero_test;
  _snapshot_check();
  pcStack_860 = (code *)0x119df6;
  pfStack_320 = pfVar9;
  aStack_318 = handle_00;
  aStack_310 = unaff_R13;
  paStack_300 = paVar29;
  paStack_2f8 = __s;
  gettimeofday((timeval *)(acStack_7d0 + 8),(__timezone_ptr_t)0x0);
  pcStack_860 = (code *)0x119dfb;
  memleak_start();
  pcStack_860 = (code *)0x119e07;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_860 = (code *)0x119e17;
  fdb_get_default_config();
  pcStack_860 = (code *)0x119e21;
  fdb_get_default_kvs_config();
  fStack_418.buffercache_size = 0;
  fStack_418.wal_threshold = 0x400;
  fStack_418.flags = 1;
  fStack_418.compaction_threshold = '\0';
  pcStack_860 = (code *)0x119e54;
  fStack_418.multi_kv_instances = (bool)(char)uVar20;
  fdb_open(&pfStack_848,"./mvcc_test1",&fStack_418);
  uStack_83c = uVar20;
  if (uVar20 == 0) {
    pcStack_860 = (code *)0x119ec3;
    fdb_kvs_open_default(pfStack_848,apfStack_838,&fStack_7e8);
    lVar15 = 1;
  }
  else {
    ppfVar12 = apfStack_838;
    handle_00.seqtree = (btree *)&fStack_7e8;
    uVar5 = 0;
    do {
      pcStack_860 = (code *)0x119e88;
      sprintf(acStack_7d0,"kv%d",uVar5 & 0xffffffff);
      pcStack_860 = (code *)0x119e9b;
      fdb_kvs_open(pfStack_848,ppfVar12,acStack_7d0,(fdb_kvs_config *)handle_00.seqtree);
      uVar5 = uVar5 + 1;
      ppfVar12 = ppfVar12 + 1;
    } while (uVar5 != 4);
    lVar15 = 4;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  ppfVar12 = (fdb_kvs_handle **)0x0;
  pcVar10 = logCallbackFunc;
  pcVar30 = "rollback_to_zero_test";
  do {
    pfVar9 = apfStack_838[(long)ppfVar12];
    pcStack_860 = (code *)0x119ee9;
    fVar2 = fdb_set_log_callback(pfVar9,logCallbackFunc,"rollback_to_zero_test");
    iVar4 = (int)pfVar9;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_860 = (code *)0x11a472;
      rollback_to_zero_test();
      goto LAB_0011a472;
    }
    ppfVar12 = (fdb_kvs_handle **)((long)ppfVar12 + 1);
  } while ((fdb_kvs_handle **)lVar15 != ppfVar12);
  uVar5 = 0;
  do {
    pcStack_860 = (code *)0x119f18;
    sprintf(acStack_618,"key%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x119f34;
    sprintf(acStack_718,"meta%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x119f50;
    sprintf(acStack_518,"body%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x119f63;
    sVar6 = strlen(acStack_618);
    pcStack_860 = (code *)0x119f6e;
    sVar7 = strlen(acStack_718);
    pcStack_860 = (code *)0x119f79;
    sVar8 = strlen(acStack_518);
    pcStack_860 = (code *)0x119f9e;
    fdb_doc_create((fdb_doc **)&aaStack_7b8[uVar5].seqtree,acStack_618,sVar6,acStack_718,sVar7,
                   acStack_518,sVar8);
    lVar24 = 0;
    do {
      pcStack_860 = (code *)0x119fae;
      fdb_set(apfStack_838[lVar24],(fdb_doc *)aaStack_7b8[uVar5].seqtree);
      lVar24 = lVar24 + 1;
    } while (lVar15 != lVar24);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 5);
  pcStack_860 = (code *)0x119fd2;
  fdb_commit(pfStack_848,'\x01');
  uVar5 = 5;
  do {
    pcStack_860 = (code *)0x119ff4;
    sprintf(acStack_618,"key%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x11a010;
    sprintf(acStack_718,"meta%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x11a02c;
    sprintf(acStack_518,"body%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x11a03f;
    sVar6 = strlen(acStack_618);
    pcStack_860 = (code *)0x11a04a;
    sVar7 = strlen(acStack_718);
    pcStack_860 = (code *)0x11a055;
    sVar8 = strlen(acStack_518);
    pcStack_860 = (code *)0x11a07a;
    fdb_doc_create((fdb_doc **)&aaStack_7b8[uVar5].seqtree,acStack_618,sVar6,acStack_718,sVar7,
                   acStack_518,sVar8);
    lVar24 = 0;
    do {
      pcStack_860 = (code *)0x11a08b;
      fdb_set(apfStack_838[lVar24],(fdb_doc *)aaStack_7b8[uVar5].seqtree);
      lVar24 = lVar24 + 1;
    } while (lVar15 != lVar24);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 10);
  pcStack_860 = (code *)0x11a0ac;
  fdb_commit(pfStack_848,'\0');
  uVar5 = 10;
  do {
    pcStack_860 = (code *)0x11a0ce;
    sprintf(acStack_618,"key%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x11a0ea;
    sprintf(acStack_718,"meta%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x11a106;
    sprintf(acStack_518,"body%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x11a119;
    sVar6 = strlen(acStack_618);
    pcStack_860 = (code *)0x11a124;
    sVar7 = strlen(acStack_718);
    pcStack_860 = (code *)0x11a12f;
    sVar8 = strlen(acStack_518);
    pcStack_860 = (code *)0x11a154;
    fdb_doc_create((fdb_doc **)&aaStack_7b8[uVar5].seqtree,acStack_618,sVar6,acStack_718,sVar7,
                   acStack_518,sVar8);
    lVar24 = 0;
    do {
      pcStack_860 = (code *)0x11a165;
      fdb_set(apfStack_838[lVar24],(fdb_doc *)aaStack_7b8[uVar5].seqtree);
      lVar24 = lVar24 + 1;
    } while (lVar15 != lVar24);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0xf);
  pcStack_860 = (code *)0x11a189;
  fdb_commit(pfStack_848,'\x01');
  uVar5 = 0xf;
  do {
    pcStack_860 = (code *)0x11a1ab;
    sprintf(acStack_618,"key%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x11a1c7;
    sprintf(acStack_718,"meta%d",uVar5 & 0xffffffff);
    pcStack_860 = (code *)0x11a1e3;
    sprintf(acStack_518,"body%d",uVar5 & 0xffffffff);
    handle_00.seqtree = (btree *)(aaStack_7b8 + uVar5);
    pcStack_860 = (code *)0x11a1f6;
    sVar6 = strlen(acStack_618);
    pcStack_860 = (code *)0x11a201;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_718);
    pcStack_860 = (code *)0x11a20c;
    sVar7 = strlen(acStack_518);
    pcStack_860 = (code *)0x11a231;
    fdb_doc_create((fdb_doc **)handle_00.seqtree,acStack_618,sVar6,acStack_718,(size_t)unaff_R13,
                   acStack_518,sVar7);
    ppfVar12 = (fdb_kvs_handle **)0x0;
    do {
      pcStack_860 = (code *)0x11a242;
      fdb_set(apfStack_838[(long)ppfVar12],
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(handle_00.seqtree)->ksize)->
              seqtree);
      ppfVar12 = (fdb_kvs_handle **)((long)ppfVar12 + 1);
    } while ((fdb_kvs_handle **)lVar15 != ppfVar12);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x14);
  pcStack_860 = (code *)0x11a263;
  fdb_commit(pfStack_848,'\0');
  pcVar10 = (code *)(ulong)uStack_83c;
  if ((char)uStack_83c != '\0') {
    handle_00.seqtree = (btree *)&fStack_818.doc_count;
    unaff_R13.seqtree = (btree *)&fStack_818.space_used;
    pcVar10 = (code *)(apfStack_838 + 4);
    pcVar30 = (char *)apfStack_838;
    do {
      ppfVar12 = (fdb_kvs_handle **)pcVar30;
      pcStack_860 = (code *)0x11a290;
      ppfVar28 = ppfVar12;
      fVar2 = fdb_rollback(ppfVar12,0);
      iVar4 = (int)ppfVar28;
      pcVar30 = (char *)ppfVar12;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a477;
      pfVar9 = *ppfVar12;
      pcStack_860 = (code *)0x11a2a6;
      fVar2 = fdb_get_kvs_info(pfVar9,(fdb_kvs_info *)pcVar10);
      iVar4 = (int)pfVar9;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a472;
      if (fStack_818.last_seqnum != 0) {
        pcStack_860 = (code *)0x11a30f;
        rollback_to_zero_test();
      }
      if (fStack_818.doc_count != 0) {
        pcStack_860 = (code *)0x11a319;
        rollback_to_zero_test();
      }
      if (fStack_818.space_used != 0) {
        pcStack_860 = (code *)0x11a323;
        rollback_to_zero_test();
      }
      pfVar9 = *ppfVar12;
      pcStack_860 = (code *)0x11a2d6;
      fVar2 = fdb_get(pfVar9,(fdb_doc *)aaStack_7b8[0].seqtree);
      iVar4 = (int)pfVar9;
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a481;
      pfVar9 = *ppfVar12;
      pcStack_860 = (code *)0x11a2ef;
      fVar2 = fdb_set(pfVar9,(fdb_doc *)aaStack_7b8[0].seqtree);
      iVar4 = (int)pfVar9;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a47c;
      pcVar30 = (char *)(ppfVar12 + 1);
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
LAB_0011a3bb:
    pcStack_860 = (code *)0x11a3ca;
    pfVar21 = pfStack_848;
    fVar2 = fdb_commit(pfStack_848,'\x01');
    iVar4 = (int)pfVar21;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_860 = (code *)0x11a3dc;
      fdb_close(pfStack_848);
      lVar15 = 0;
      do {
        pcStack_860 = (code *)0x11a3eb;
        fdb_doc_free((fdb_doc *)aaStack_7b8[lVar15].seqtree);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x14);
      pcStack_860 = (code *)0x11a3f9;
      fdb_shutdown();
      pcStack_860 = (code *)0x11a3fe;
      memleak_end();
      pcVar30 = "single kv mode:";
      if ((char)uStack_83c != '\0') {
        pcVar30 = "multiple kv mode:";
      }
      pcStack_860 = (code *)0x11a42e;
      sprintf(acStack_518,"rollback to zero test %s",pcVar30);
      pcVar30 = "%s PASSED\n";
      if (rollback_to_zero_test(bool)::__test_pass != '\0') {
        pcVar30 = "%s FAILED\n";
      }
      pcStack_860 = (code *)0x11a45b;
      iVar4 = fprintf(_stderr,pcVar30,acStack_518);
      return iVar4;
    }
    goto LAB_0011a486;
  }
  ppfVar28 = apfStack_838;
  pcStack_860 = (code *)0x11a331;
  fVar2 = fdb_rollback(ppfVar28,0);
  iVar4 = (int)ppfVar28;
  pcVar30 = (char *)0x14;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a48b;
  pcStack_860 = (code *)0x11a348;
  pfVar9 = apfStack_838[0];
  fVar2 = fdb_get_kvs_info(apfStack_838[0],(fdb_kvs_info *)(apfStack_838 + 4));
  iVar4 = (int)pfVar9;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a490;
  if (fStack_818.last_seqnum != 0) {
    pcStack_860 = (code *)0x11a362;
    rollback_to_zero_test();
  }
  if (fStack_818.doc_count != 0) {
    pcStack_860 = (code *)0x11a374;
    rollback_to_zero_test();
  }
  if (fStack_818.space_used != 0) {
    pcStack_860 = (code *)0x11a386;
    rollback_to_zero_test();
  }
  pcStack_860 = (code *)0x11a398;
  pfVar9 = apfStack_838[0];
  fVar2 = fdb_get(apfStack_838[0],(fdb_doc *)aaStack_7b8[0].seqtree);
  iVar4 = (int)pfVar9;
  if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a495;
  pcStack_860 = (code *)0x11a3b3;
  fVar2 = fdb_set(apfStack_838[0],(fdb_doc *)aaStack_7b8[0].seqtree);
  iVar4 = (int)apfStack_838[0];
  if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011a3bb;
  goto LAB_0011a49a;
LAB_0011aacb:
  pcStack_b88 = (code *)0x11aad0;
  rollback_to_zero_after_compact_test();
LAB_0011aad0:
  pcStack_b88 = (code *)0x11aad5;
  rollback_to_zero_after_compact_test();
LAB_0011aad5:
  pcStack_b88 = (code *)0x11aada;
  rollback_to_zero_after_compact_test();
LAB_0011aada:
  pcStack_b88 = (code *)0x11aadf;
  rollback_to_zero_after_compact_test();
  goto LAB_0011aadf;
LAB_0011b7d0:
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7d5;
  rollback_all_test();
LAB_0011b7d5:
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7da;
  rollback_all_test();
LAB_0011b7da:
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7e2;
  rollback_all_test();
  aVar19 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar10;
LAB_0011b7e2:
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7e7;
  rollback_all_test();
LAB_0011b7e7:
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7ec;
  rollback_all_test();
LAB_0011b7ec:
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7f1;
  rollback_all_test();
LAB_0011b7f1:
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7f6;
  rollback_all_test();
  goto LAB_0011b7f6;
LAB_0011bfab:
  aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfb0;
  rollback_during_ops_test();
LAB_0011bfb0:
  aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfb5;
  rollback_during_ops_test();
  goto LAB_0011bfb5;
LAB_0011c3a8:
  aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3ad;
  in_memory_snapshot_rollback_test();
  goto LAB_0011c3ad;
LAB_0011c7bd:
  pcStack_4a30 = (code *)0x11c7c2;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7c2:
  pcStack_4a30 = (code *)0x11c7c7;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7c7:
  pcStack_4a30 = (code *)0x11c7cc;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7cc:
  pcStack_4a30 = (code *)0x11c7d1;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7d1:
  pcStack_4a30 = (code *)0x11c7d6;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7d6:
  pcStack_4a30 = (code *)0x11c7db;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7db:
  pcStack_4a30 = (code *)0x11c7e0;
  rollback_drop_multi_files_kvs_test();
  goto LAB_0011c7e0;
LAB_0011cd0f:
  pcStack_4f38 = (code *)0x11cd14;
  rollback_without_seqtree();
  goto LAB_0011cd14;
LAB_0011d0a5:
  pfStack_5110 = (fdb_kvs_handle *)0x11d0aa;
  tx_crash_recover_test();
LAB_0011d0aa:
  pfStack_5110 = (fdb_kvs_handle *)0x11d0af;
  tx_crash_recover_test();
  goto LAB_0011d0af;
LAB_0011a472:
  pcStack_860 = (code *)0x11a477;
  rollback_to_zero_test();
LAB_0011a477:
  pcStack_860 = (code *)0x11a47c;
  rollback_to_zero_test();
LAB_0011a47c:
  pcStack_860 = (code *)0x11a481;
  rollback_to_zero_test();
LAB_0011a481:
  pcStack_860 = (code *)0x11a486;
  rollback_to_zero_test();
LAB_0011a486:
  pcStack_860 = (code *)0x11a48b;
  rollback_to_zero_test();
LAB_0011a48b:
  pcStack_860 = (code *)0x11a490;
  rollback_to_zero_test();
LAB_0011a490:
  pcStack_860 = (code *)0x11a495;
  rollback_to_zero_test();
LAB_0011a495:
  pcStack_860 = (code *)0x11a49a;
  rollback_to_zero_test();
LAB_0011a49a:
  pcStack_860 = rollback_to_zero_after_compact_test;
  rollback_to_zero_test();
  pcStack_b88 = (code *)0x11a4c1;
  pfStack_888 = (fdb_kvs_info *)pcVar10;
  aStack_880 = handle_00;
  aStack_878 = unaff_R13;
  ppfStack_870 = ppfVar12;
  ppfStack_868 = (fdb_kvs_handle **)pcVar30;
  pcStack_860 = (code *)lVar15;
  gettimeofday(&tStack_a30,(__timezone_ptr_t)0x0);
  pcStack_b88 = (code *)0x11a4cd;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_b88 = (code *)0x11a4dd;
  fdb_get_default_config();
  pcStack_b88 = (code *)0x11a4ea;
  fdb_get_default_kvs_config();
  fStack_980.buffercache_size = 0;
  fStack_980.wal_threshold = 0x400;
  fStack_980.flags = 1;
  fStack_980.compaction_threshold = '\0';
  pcStack_b88 = (code *)0x11a51d;
  fStack_980.multi_kv_instances = (bool)(char)iVar4;
  fdb_open((fdb_file_handle **)&pfStack_b78,"./mvcc_test1",&fStack_980);
  iStack_b6c = iVar4;
  if (iVar4 == 0) {
    pcStack_b88 = (code *)0x11a592;
    fdb_kvs_open_default
              ((fdb_file_handle *)pfStack_b78,(fdb_kvs_handle **)auStack_b60,
               (fdb_kvs_config *)(auStack_b60 + 0xd0));
    pcVar30 = (char *)0x1;
  }
  else {
    ppfVar12 = (fdb_kvs_handle **)auStack_b60;
    handle_00.seqtree = (btree *)(auStack_b60 + 0xd0);
    uVar5 = 0;
    do {
      pcStack_b88 = (code *)0x11a554;
      sprintf(acStack_a78,"kv%d",uVar5 & 0xffffffff);
      pcStack_b88 = (code *)0x11a567;
      fdb_kvs_open((fdb_file_handle *)pfStack_b78,ppfVar12,acStack_a78,
                   (fdb_kvs_config *)handle_00.seqtree);
      uVar5 = uVar5 + 1;
      ppfVar12 = ppfVar12 + 1;
    } while (uVar5 != 4);
    pcVar30 = (char *)0x4;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  pcVar26 = (char *)0x0;
  pcVar10 = logCallbackFunc;
  pcVar25 = "rollback_to_zero_after_compact_test";
  do {
    pfVar9 = *(fdb_kvs_handle **)(auStack_b60 + (long)pcVar26 * 8);
    pcStack_b88 = (code *)0x11a5b8;
    fVar2 = fdb_set_log_callback(pfVar9,logCallbackFunc,"rollback_to_zero_after_compact_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_b88 = (code *)0x11aacb;
      rollback_to_zero_after_compact_test();
      goto LAB_0011aacb;
    }
    pcVar26 = pcVar26 + 1;
  } while (pcVar30 != pcVar26);
  uVar5 = 0;
  do {
    pcStack_b88 = (code *)0x11a5e7;
    sprintf(auStack_b60 + 0x90,"key%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a5fd;
    sprintf(auStack_b60 + 0x50,"meta%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a616;
    sprintf(acStack_a70,"body%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a629;
    sVar6 = strlen(auStack_b60 + 0x90);
    pcStack_b88 = (code *)0x11a639;
    sVar7 = strlen(auStack_b60 + 0x50);
    pcStack_b88 = (code *)0x11a649;
    sVar8 = strlen(acStack_a70);
    pcStack_b88 = (code *)0x11a66e;
    fdb_doc_create((fdb_doc **)&aaStack_a20[uVar5].seqtree,auStack_b60 + 0x90,sVar6,
                   auStack_b60 + 0x50,sVar7,acStack_a70,sVar8);
    lVar15 = 0;
    do {
      pcStack_b88 = (code *)0x11a67f;
      fdb_set(*(fdb_kvs_handle **)(auStack_b60 + lVar15 * 8),(fdb_doc *)aaStack_a20[uVar5].seqtree);
      lVar15 = lVar15 + 1;
    } while (pcVar30 != (char *)lVar15);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 5);
  pcStack_b88 = (code *)0x11a6a3;
  fdb_commit((fdb_file_handle *)pfStack_b78,'\x01');
  uVar5 = 5;
  do {
    pcStack_b88 = (code *)0x11a6c5;
    sprintf(auStack_b60 + 0x90,"key%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a6de;
    sprintf(auStack_b60 + 0x50,"meta%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a6fa;
    sprintf(acStack_a70,"body%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a70d;
    sVar6 = strlen(auStack_b60 + 0x90);
    pcStack_b88 = (code *)0x11a718;
    sVar7 = strlen(auStack_b60 + 0x50);
    pcStack_b88 = (code *)0x11a723;
    sVar8 = strlen(acStack_a70);
    pcStack_b88 = (code *)0x11a745;
    fdb_doc_create((fdb_doc **)&aaStack_a20[uVar5].seqtree,auStack_b60 + 0x90,sVar6,
                   auStack_b60 + 0x50,sVar7,acStack_a70,sVar8);
    lVar15 = 0;
    do {
      pcStack_b88 = (code *)0x11a755;
      fdb_set(*(fdb_kvs_handle **)(auStack_b60 + lVar15 * 8),(fdb_doc *)aaStack_a20[uVar5].seqtree);
      lVar15 = lVar15 + 1;
    } while (pcVar30 != (char *)lVar15);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 10);
  pcStack_b88 = (code *)0x11a776;
  fdb_commit((fdb_file_handle *)pfStack_b78,'\0');
  uVar5 = 10;
  do {
    pcStack_b88 = (code *)0x11a798;
    sprintf(auStack_b60 + 0x90,"key%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a7b1;
    sprintf(auStack_b60 + 0x50,"meta%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a7cd;
    sprintf(acStack_a70,"body%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a7e0;
    sVar6 = strlen(auStack_b60 + 0x90);
    pcStack_b88 = (code *)0x11a7eb;
    sVar7 = strlen(auStack_b60 + 0x50);
    pcStack_b88 = (code *)0x11a7f6;
    sVar8 = strlen(acStack_a70);
    pcStack_b88 = (code *)0x11a818;
    fdb_doc_create((fdb_doc **)&aaStack_a20[uVar5].seqtree,auStack_b60 + 0x90,sVar6,
                   auStack_b60 + 0x50,sVar7,acStack_a70,sVar8);
    lVar15 = 0;
    do {
      pcStack_b88 = (code *)0x11a828;
      fdb_set(*(fdb_kvs_handle **)(auStack_b60 + lVar15 * 8),(fdb_doc *)aaStack_a20[uVar5].seqtree);
      lVar15 = lVar15 + 1;
    } while (pcVar30 != (char *)lVar15);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0xf);
  pcStack_b88 = (code *)0x11a84c;
  fdb_commit((fdb_file_handle *)pfStack_b78,'\x01');
  uVar5 = 0xf;
  do {
    pcStack_b88 = (code *)0x11a86e;
    sprintf(auStack_b60 + 0x90,"key%d",uVar5 & 0xffffffff);
    pcStack_b88 = (code *)0x11a887;
    sprintf(auStack_b60 + 0x50,"meta%d",uVar5 & 0xffffffff);
    pcVar26 = acStack_a70;
    pcStack_b88 = (code *)0x11a8a3;
    sprintf(pcVar26,"body%d",uVar5 & 0xffffffff);
    unaff_R13.seqtree = (btree *)(aaStack_a20 + uVar5);
    pcStack_b88 = (code *)0x11a8b6;
    sVar6 = strlen(auStack_b60 + 0x90);
    pcStack_b88 = (code *)0x11a8c1;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(auStack_b60 + 0x50);
    pcStack_b88 = (code *)0x11a8cc;
    sVar7 = strlen(pcVar26);
    pcStack_b88 = (code *)0x11a8ee;
    fdb_doc_create((fdb_doc **)unaff_R13.seqtree,auStack_b60 + 0x90,sVar6,auStack_b60 + 0x50,
                   (size_t)handle_00,pcVar26,sVar7);
    pcVar10 = (code *)0x0;
    do {
      pcStack_b88 = (code *)0x11a8fe;
      fdb_set(*(fdb_kvs_handle **)(auStack_b60 + (long)pcVar10 * 8),
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(unaff_R13.seqtree)->ksize)->
              seqtree);
      pcVar10 = (code *)((long)pcVar10 + 1);
    } while ((code *)pcVar30 != pcVar10);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x14);
  pcStack_b88 = (code *)0x11a91f;
  fdb_commit((fdb_file_handle *)pfStack_b78,'\0');
  pfVar9 = (fdb_kvs_handle *)&pfStack_b68;
  pcStack_b88 = (code *)0x11a938;
  fVar2 = fdb_open((fdb_file_handle **)pfVar9,"./mvcc_test1",&fStack_980);
  pcVar25 = (char *)0x14;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_b88 = (code *)0x11a951;
    pfVar9 = pfStack_b68;
    fVar2 = fdb_compact((fdb_file_handle *)pfStack_b68,"./mvcc_test2");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aae4;
    pcStack_b88 = (code *)0x11a963;
    fdb_close((fdb_file_handle *)pfStack_b68);
    pcVar26 = auStack_b60 + 0x30;
    handle_00.seqtree = (btree *)(auStack_b60 + 0x40);
    pcVar30 = (char *)(ulong)(uint)((int)pcVar30 << 3);
    pcVar25 = (char *)0x0;
    unaff_R13.seqtree = (btree *)(auStack_b60 + 0x20);
    do {
      pcVar10 = (code *)(auStack_b60 + (long)pcVar25);
      pcStack_b88 = (code *)0x11a98a;
      pfVar9 = (fdb_kvs_handle *)pcVar10;
      fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar10,0);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aad0;
      pfVar9 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar10)->kvs_config;
      pcStack_b88 = (code *)0x11a99d;
      fVar2 = fdb_get_kvs_info(pfVar9,(fdb_kvs_info *)unaff_R13.seqtree);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aacb;
      if ((hbtrie *)auStack_b60._40_8_ != (hbtrie *)0x0) {
        pcStack_b88 = (code *)0x11aa03;
        rollback_to_zero_after_compact_test();
      }
      if ((btree *)auStack_b60._48_8_ != (btree *)0x0) {
        pcStack_b88 = (code *)0x11aa0d;
        rollback_to_zero_after_compact_test();
      }
      if ((filemgr *)auStack_b60._64_8_ != (filemgr *)0x0) {
        pcStack_b88 = (code *)0x11aa17;
        rollback_to_zero_after_compact_test();
      }
      pfVar9 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar10)->kvs_config;
      pcStack_b88 = (code *)0x11a9cd;
      fVar2 = fdb_get(pfVar9,(fdb_doc *)aaStack_a20[0].seqtree);
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011aada;
      pfVar9 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar10)->kvs_config;
      pcStack_b88 = (code *)0x11a9e6;
      fVar2 = fdb_set(pfVar9,(fdb_doc *)aaStack_a20[0].seqtree);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aad5;
      pcVar25 = pcVar25 + 8;
    } while (pcVar30 != pcVar25);
    pcStack_b88 = (code *)0x11aa28;
    pfVar9 = pfStack_b78;
    fVar2 = fdb_commit((fdb_file_handle *)pfStack_b78,'\x01');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_b88 = (code *)0x11aa3a;
      fdb_close((fdb_file_handle *)pfStack_b78);
      lVar15 = 0;
      do {
        pcStack_b88 = (code *)0x11aa49;
        fdb_doc_free((fdb_doc *)aaStack_a20[lVar15].seqtree);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x14);
      pcStack_b88 = (code *)0x11aa57;
      fdb_shutdown();
      pcVar30 = "single kv mode:";
      if ((char)iStack_b6c != '\0') {
        pcVar30 = "multiple kv mode:";
      }
      pcStack_b88 = (code *)0x11aa87;
      sprintf(acStack_a70,"rollback to zero after compact test %s",pcVar30);
      pcVar30 = "%s PASSED\n";
      if (rollback_to_zero_after_compact_test(bool)::__test_pass != '\0') {
        pcVar30 = "%s FAILED\n";
      }
      pcStack_b88 = (code *)0x11aab4;
      iVar4 = fprintf(_stderr,pcVar30,acStack_a70);
      return iVar4;
    }
  }
  else {
LAB_0011aadf:
    pcStack_b88 = (code *)0x11aae4;
    rollback_to_zero_after_compact_test();
LAB_0011aae4:
    pcStack_b88 = (code *)0x11aae9;
    rollback_to_zero_after_compact_test();
  }
  pcStack_b88 = rollback_to_wal_test;
  rollback_to_zero_after_compact_test();
  __s_00 = (char *)((ulong)pfVar9 & 0xffffffff);
  pcStack_1990 = (code *)0x11ab0d;
  pfStack_bb0 = (fdb_kvs_handle *)pcVar10;
  aStack_ba8 = handle_00;
  aStack_ba0 = unaff_R13;
  pcStack_b98 = pcVar25;
  pcStack_b90 = pcVar26;
  pcStack_b88 = (code *)pcVar30;
  gettimeofday((timeval *)(auStack_1978 + 0x38),(__timezone_ptr_t)0x0);
  pcStack_1990 = (code *)0x11ab12;
  memleak_start();
  pcStack_1990 = (code *)0x11ab1e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_1990 = (code *)0x11ab2e;
  fdb_get_default_config();
  config = &fStack_1930;
  pcStack_1990 = (code *)0x11ab3b;
  fdb_get_default_kvs_config();
  fStack_1610.buffercache_size = 0;
  fStack_1610.wal_threshold = 0x100;
  fStack_1610.flags = 1;
  fStack_1610.compaction_threshold = '\0';
  auStack_1978._28_4_ = SUB84(pfVar9,0);
  fStack_1610.multi_kv_instances = SUB81(__s_00,0);
  doc_01 = (fdb_doc **)(auStack_1978 + 8);
  pcStack_1990 = (code *)0x11ab75;
  fdb_open((fdb_file_handle **)doc_01,"./mvcc_test8",&fStack_1610);
  ptr_handle = (fdb_doc *)auStack_1978;
  pcStack_1990 = (code *)0x11ab88;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1978._8_8_,(fdb_kvs_handle **)ptr_handle,config);
  pcStack_1990 = (code *)0x11ab9e;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1978._0_8_,logCallbackFunc,"rollback_to_wal_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    lVar15 = 0;
    uVar5 = 0;
    do {
      pcStack_1990 = (code *)0x11abc8;
      sprintf(acStack_1818,"key%d",uVar5 & 0xffffffff);
      pcStack_1990 = (code *)0x11abe1;
      sprintf(acStack_1718,"meta%d",uVar5 & 0xffffffff);
      pcStack_1990 = (code *)0x11abf7;
      sprintf((char *)afStack_1918,"body%d",uVar5 & 0xffffffff);
      pcStack_1990 = (code *)0x11ac0a;
      sVar6 = strlen(acStack_1818);
      pcStack_1990 = (code *)0x11ac1d;
      sVar7 = strlen(acStack_1718);
      pcStack_1990 = (code *)0x11ac2a;
      sVar8 = strlen((char *)afStack_1918);
      pcStack_1990 = (code *)0x11ac4c;
      fdb_doc_create((fdb_doc **)((long)&pfStack_1518 + lVar15),acStack_1818,sVar6,acStack_1718,
                     sVar7,afStack_1918,sVar8);
      pcStack_1990 = (code *)0x11ac5e;
      fdb_set((fdb_kvs_handle *)auStack_1978._0_8_,(&pfStack_1518)[uVar5]);
      uVar5 = uVar5 + 1;
      lVar15 = lVar15 + 8;
    } while (uVar5 != 300);
    pcStack_1990 = (code *)0x11ac7e;
    fdb_commit((fdb_file_handle *)auStack_1978._8_8_,'\0');
    lVar15 = 0;
    uVar5 = 0;
    do {
      auStack_1978._40_8_ = (fdb_doc **)((long)&pfStack_1518 + lVar15);
      pcStack_1990 = (code *)0x11aca0;
      fdb_doc_free((&pfStack_1518)[uVar5]);
      pcStack_1990 = (code *)0x11acbc;
      sprintf(acStack_1818,"key%d",uVar5 & 0xffffffff);
      pcStack_1990 = (code *)0x11acd8;
      sprintf(acStack_1718,"META%d",uVar5 & 0xffffffff);
      pcStack_1990 = (code *)0x11acf1;
      sprintf((char *)afStack_1918,"BODY%d",uVar5 & 0xffffffff);
      pcStack_1990 = (code *)0x11acf9;
      sVar6 = strlen(acStack_1818);
      pcStack_1990 = (code *)0x11ad04;
      sVar7 = strlen(acStack_1718);
      pcStack_1990 = (code *)0x11ad0f;
      sVar8 = strlen((char *)afStack_1918);
      pcStack_1990 = (code *)0x11ad31;
      fdb_doc_create((fdb_doc **)auStack_1978._40_8_,acStack_1818,sVar6,acStack_1718,sVar7,
                     afStack_1918,sVar8);
      pcStack_1990 = (code *)0x11ad43;
      fdb_set((fdb_kvs_handle *)auStack_1978._0_8_,(&pfStack_1518)[uVar5]);
      uVar5 = uVar5 + 1;
      lVar15 = lVar15 + 8;
    } while (uVar5 != 0x96);
    pcStack_1990 = (code *)0x11ad63;
    fdb_commit((fdb_file_handle *)auStack_1978._8_8_,'\0');
    uVar5 = 0x96;
    doc_01 = apfStack_1068;
    do {
      pcStack_1990 = (code *)0x11ad79;
      fdb_doc_free(*doc_01);
      pcStack_1990 = (code *)0x11ad95;
      sprintf(acStack_1818,"key%d",uVar5 & 0xffffffff);
      __s_00 = acStack_1718;
      pcStack_1990 = (code *)0x11adb1;
      sprintf(__s_00,"Meta%d",uVar5 & 0xffffffff);
      ptr_handle = afStack_1918;
      pcStack_1990 = (code *)0x11adca;
      sprintf((char *)ptr_handle,"Body%d",uVar5 & 0xffffffff);
      pcStack_1990 = (code *)0x11add2;
      handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_1818);
      pcStack_1990 = (code *)0x11addd;
      unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(__s_00);
      pcStack_1990 = (code *)0x11ade8;
      sVar6 = strlen((char *)ptr_handle);
      pcStack_1990 = (code *)0x11ae08;
      fdb_doc_create(doc_01,acStack_1818,(size_t)handle_00,__s_00,(size_t)unaff_R13,ptr_handle,sVar6
                    );
      pcStack_1990 = (code *)0x11ae15;
      fdb_set((fdb_kvs_handle *)auStack_1978._0_8_,*doc_01);
      uVar5 = uVar5 + 1;
      doc_01 = doc_01 + 1;
    } while (uVar5 != 300);
    pcStack_1990 = (code *)0x11ae35;
    fdb_commit((fdb_file_handle *)auStack_1978._8_8_,'\0');
    pcStack_1990 = (code *)0x11ae44;
    fVar2 = fdb_rollback((fdb_kvs_handle **)auStack_1978,0x1c2);
    config = (fdb_kvs_config *)0x12c;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011afa5;
    pcStack_1990 = (code *)0x11ae75;
    fdb_doc_create((fdb_doc **)(auStack_1978 + 0x10),(void *)psStack_1510[4],*psStack_1510,
                   (void *)0x0,0,(void *)0x0,0);
    pcStack_1990 = (code *)0x11ae89;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1978._0_8_,
                              (fdb_kvs_handle **)(auStack_1978 + 0x20),0x1c2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011afaa;
    pcStack_1990 = (code *)0x11aea0;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_1978._32_8_,(fdb_doc *)auStack_1978._16_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011afaf;
    config = *(fdb_kvs_config **)(auStack_1978._16_8_ + 0x40);
    doc_01 = (fdb_doc **)psStack_1510[8];
    pcStack_1990 = (code *)0x11aecc;
    iVar4 = bcmp(config,doc_01,*(size_t *)(auStack_1978._16_8_ + 0x10));
    ptr_handle = (fdb_doc *)auStack_1978._16_8_;
    if (iVar4 == 0) {
      if (*(fdb_seqnum_t *)(auStack_1978._16_8_ + 0x28) != 0x12e) {
        pcStack_1990 = (code *)0x11aef0;
        rollback_to_wal_test();
        auStack_1978._16_8_ = auStack_1978._48_8_;
      }
      pcStack_1990 = (code *)0x11aefb;
      fdb_doc_free((fdb_doc *)auStack_1978._16_8_);
      pcStack_1990 = (code *)0x11af05;
      fdb_kvs_close((fdb_kvs_handle *)auStack_1978._32_8_);
      pcStack_1990 = (code *)0x11af0f;
      fdb_close((fdb_file_handle *)auStack_1978._8_8_);
      lVar15 = 0;
      do {
        pcStack_1990 = (code *)0x11af1e;
        fdb_doc_free((&pfStack_1518)[lVar15]);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 300);
      pcStack_1990 = (code *)0x11af2f;
      fdb_shutdown();
      pcStack_1990 = (code *)0x11af34;
      memleak_end();
      pcVar30 = "single kv mode:";
      if (auStack_1978[0x1c] != '\0') {
        pcVar30 = "multiple kv mode:";
      }
      pcStack_1990 = (code *)0x11af61;
      sprintf((char *)afStack_1918,"rollback to wal test %s",pcVar30);
      pcVar30 = "%s PASSED\n";
      if (rollback_to_wal_test(bool)::__test_pass != '\0') {
        pcVar30 = "%s FAILED\n";
      }
      pcStack_1990 = (code *)0x11af8e;
      iVar4 = fprintf(_stderr,pcVar30,afStack_1918);
      return iVar4;
    }
  }
  else {
    pcStack_1990 = (code *)0x11afa5;
    rollback_to_wal_test();
LAB_0011afa5:
    pcStack_1990 = (code *)0x11afaa;
    rollback_to_wal_test();
LAB_0011afaa:
    pcStack_1990 = (code *)0x11afaf;
    rollback_to_wal_test();
LAB_0011afaf:
    pcStack_1990 = (code *)0x11afb4;
    rollback_to_wal_test();
  }
  pcStack_1990 = rollback_all_test;
  ppfVar22 = doc_01;
  rollback_to_wal_test();
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afe4;
  pfStack_19b8 = ptr_handle;
  aStack_19b0 = handle_00;
  aStack_19a8 = unaff_R13;
  pfStack_19a0 = config;
  ppfStack_1998 = doc_01;
  pcStack_1990 = (code *)__s_00;
  gettimeofday(&tStack_1e60,(__timezone_ptr_t)0x0);
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afe9;
  memleak_start();
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aff5;
  system("rm -rf  mvcc_test* > errorlog.txt");
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b005;
  fdb_get_default_config();
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b00f;
  fdb_get_default_kvs_config();
  fStack_1ab0.buffercache_size._0_1_ = '\0';
  fStack_1ab0.buffercache_size._1_1_ = '\0';
  fStack_1ab0.buffercache_size._2_1_ = '\0';
  fStack_1ab0.buffercache_size._3_1_ = '\0';
  fStack_1ab0.buffercache_size._4_1_ = '\0';
  fStack_1ab0.buffercache_size._5_1_ = '\0';
  fStack_1ab0.buffercache_size._6_1_ = '\0';
  fStack_1ab0.buffercache_size._7_1_ = '\0';
  fStack_1ab0.wal_threshold._0_1_ = '\0';
  fStack_1ab0.wal_threshold._1_1_ = '\x04';
  fStack_1ab0.wal_threshold._2_1_ = '\0';
  fStack_1ab0.wal_threshold._3_1_ = '\0';
  fStack_1ab0.wal_threshold._4_1_ = '\0';
  fStack_1ab0.wal_threshold._5_1_ = '\0';
  fStack_1ab0.wal_threshold._6_1_ = '\0';
  fStack_1ab0.wal_threshold._7_1_ = '\0';
  fStack_1ab0.flags = 1;
  fStack_1ab0.compaction_threshold = 0;
  fStack_1ab0.block_reusing_threshold = 0;
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b045;
  fStack_1ab0.multi_kv_instances = (bool)(char)ppfVar22;
  fdb_open(&pfStack_1f08,"./mvcc_test6",(fdb_config *)(acStack_1bb0 + 0x100));
  iStack_1efc = (int)ppfVar22;
  if (iStack_1efc == 0) {
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0b1;
    fdb_kvs_open_default
              (pfStack_1f08,(fdb_kvs_handle **)&aaStack_1ee0[0].seqtree,
               (fdb_kvs_config *)(acStack_1eb0 + 8));
    aVar16 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
  }
  else {
    paVar11 = aaStack_1ee0;
    handle_00.seqtree = (btree *)(acStack_1eb0 + 8);
    uVar5 = 0;
    do {
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b076;
      sprintf(acStack_1eb0,"kv%d",uVar5 & 0xffffffff);
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b089;
      fdb_kvs_open(pfStack_1f08,(fdb_kvs_handle **)&paVar11->seqtree,acStack_1eb0,
                   (fdb_kvs_config *)handle_00.seqtree);
      uVar5 = uVar5 + 1;
      paVar11 = paVar11 + 1;
    } while (uVar5 != 4);
    aVar16 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  pcVar26 = (char *)0x0;
  pcVar10 = logCallbackFunc;
  pcVar30 = "rollback_all_test";
  do {
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0d7;
    fVar2 = fdb_set_log_callback
                      ((fdb_kvs_handle *)aaStack_1ee0[(long)pcVar26].seqtree,logCallbackFunc,
                       "rollback_all_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7d0;
      rollback_all_test();
      goto LAB_0011b7d0;
    }
    pcVar26 = (char *)((hbtrie_func_readkey *)pcVar26 + 1);
  } while (aVar16.seqtree != (btree *)pcVar26);
  uVar5 = 0;
  do {
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b106;
    sprintf(acStack_1cb0,"key%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b122;
    sprintf(acStack_1db0,"meta%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b13e;
    sprintf(acStack_1bb0,"body%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b151;
    sVar6 = strlen(acStack_1cb0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b15c;
    sVar7 = strlen(acStack_1db0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b167;
    sVar8 = strlen(acStack_1bb0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b18c;
    fdb_doc_create((fdb_doc **)&aaStack_1e50[uVar5].seqtree,acStack_1cb0,sVar6,acStack_1db0,sVar7,
                   acStack_1bb0,sVar8);
    lVar15 = 0;
    do {
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b19c;
      fdb_set((fdb_kvs_handle *)aaStack_1ee0[lVar15].seqtree,(fdb_doc *)aaStack_1e50[uVar5].seqtree)
      ;
      lVar15 = lVar15 + 1;
    } while (aVar16.seqtree != (btree *)lVar15);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 5);
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1c0;
  fdb_commit(pfStack_1f08,'\x01');
  uVar5 = 5;
  do {
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1e2;
    sprintf(acStack_1cb0,"key%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1fe;
    sprintf(acStack_1db0,"meta%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b21a;
    sprintf(acStack_1bb0,"body%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b22d;
    sVar6 = strlen(acStack_1cb0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b238;
    sVar7 = strlen(acStack_1db0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b243;
    sVar8 = strlen(acStack_1bb0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b268;
    fdb_doc_create((fdb_doc **)&aaStack_1e50[uVar5].seqtree,acStack_1cb0,sVar6,acStack_1db0,sVar7,
                   acStack_1bb0,sVar8);
    lVar15 = 0;
    do {
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b279;
      fdb_set((fdb_kvs_handle *)aaStack_1ee0[lVar15].seqtree,(fdb_doc *)aaStack_1e50[uVar5].seqtree)
      ;
      lVar15 = lVar15 + 1;
    } while (aVar16.seqtree != (btree *)lVar15);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 10);
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b29a;
  fdb_commit(pfStack_1f08,'\0');
  uVar5 = 10;
  do {
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2bc;
    sprintf(acStack_1cb0,"key%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2d8;
    sprintf(acStack_1db0,"meta%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2f4;
    sprintf(acStack_1bb0,"body%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b307;
    sVar6 = strlen(acStack_1cb0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b312;
    sVar7 = strlen(acStack_1db0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b31d;
    sVar8 = strlen(acStack_1bb0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b342;
    fdb_doc_create((fdb_doc **)&aaStack_1e50[uVar5].seqtree,acStack_1cb0,sVar6,acStack_1db0,sVar7,
                   acStack_1bb0,sVar8);
    lVar15 = 0;
    do {
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b353;
      fdb_set((fdb_kvs_handle *)aaStack_1ee0[lVar15].seqtree,(fdb_doc *)aaStack_1e50[uVar5].seqtree)
      ;
      lVar15 = lVar15 + 1;
    } while (aVar16.seqtree != (btree *)lVar15);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0xf);
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b377;
  fdb_commit(pfStack_1f08,'\x01');
  uVar5 = 0xf;
  do {
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b399;
    sprintf(acStack_1cb0,"key%d",uVar5 & 0xffffffff);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3b5;
    sprintf(acStack_1db0,"meta%d",uVar5 & 0xffffffff);
    aVar19.seqtree = (btree *)acStack_1bb0;
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3d1;
    sprintf((char *)aVar19.seqtree,"body%d",uVar5 & 0xffffffff);
    handle_00.seqtree = (btree *)(aaStack_1e50 + uVar5);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3e4;
    sVar6 = strlen(acStack_1cb0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3ef;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_1db0);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3fa;
    sVar7 = strlen((char *)aVar19.seqtree);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b41f;
    fdb_doc_create((fdb_doc **)handle_00.seqtree,acStack_1cb0,sVar6,acStack_1db0,(size_t)unaff_R13,
                   aVar19.seqtree,sVar7);
    pcVar26 = (char *)0x0;
    do {
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b430;
      fdb_set((fdb_kvs_handle *)aaStack_1ee0[(long)pcVar26].seqtree,
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(handle_00.seqtree)->ksize)->
              seqtree);
      pcVar26 = (char *)((long)pcVar26 + 1);
    } while (aVar16.seqtree != (btree *)pcVar26);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x14);
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b451;
  fdb_commit(pfStack_1f08,'\0');
  aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b465;
  fVar2 = fdb_get_all_snap_markers
                    (pfStack_1f08,(fdb_snapshot_info_t **)&pfStack_1ef0,(uint64_t *)&pfStack_1ef8);
  pcVar30 = (char *)0x14;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    if ((char)iStack_1efc == '\0') {
      if (pfStack_1ef8 != (fdb_kvs_handle *)0x4) {
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b49b;
        rollback_all_test();
      }
    }
    else if (pfStack_1ef8 != (fdb_kvs_handle *)0x8) {
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b489;
      rollback_all_test();
    }
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4ae;
    fVar2 = fdb_rollback_all(pfStack_1f08,(fdb_snapshot_marker_t)pfStack_1ef0->kvs);
    if ((char)iStack_1efc == '\0') {
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7fb;
LAB_0011b5f4:
      handle_00.seqtree = (btree *)0x0;
      unaff_R13.seqtree = (btree *)&aStack_1ee8;
      pcVar30 = (char *)&aStack_1eb8;
      do {
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b613;
        fVar2 = fdb_get_kvs_info((fdb_kvs_handle *)aaStack_1ee0[(long)handle_00].seqtree,
                                 &fStack_1e90);
        pcVar10 = (code *)aVar19;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7d5;
        if (fStack_1e90.last_seqnum != 0xf) {
          aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6c7;
          rollback_all_test();
        }
        if (fStack_1e90.doc_count != 0xf) {
          aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6d9;
          rollback_all_test();
        }
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b64b;
        fVar2 = fdb_get((fdb_kvs_handle *)aaStack_1ee0[(long)handle_00].seqtree,pfStack_1db8);
        if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011b7d0;
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b673;
        fVar2 = fdb_get_kv((fdb_kvs_handle *)aaStack_1ee0[(long)handle_00].seqtree,
                           (aaStack_1e50[0].seqtrie)->aux,
                           *(size_t *)&(aaStack_1e50[0].seqtree)->ksize,(void **)unaff_R13.seqtree,
                           (size_t *)pcVar30);
        pcVar10 = (code *)aStack_1ee8;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7e2;
        pcVar26 = (char *)(aaStack_1e50[0].seqtrie)->readkey;
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b69c;
        iVar4 = bcmp(pcVar26,aStack_1ee8.seqtree,(size_t)aStack_1eb8);
        if (iVar4 != 0) goto LAB_0011b7da;
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6ac;
        free(pcVar10);
        handle_00.seqtree = (btree *)&(handle_00.seqtree)->vsize;
        aVar19 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar10;
      } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar16.seqtree != handle_00.seqtree);
      aVar19.seqtree = (btree *)0x0;
      do {
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6f2;
        fVar2 = fdb_set((fdb_kvs_handle *)aaStack_1ee0[(long)aVar19].seqtree,
                        (fdb_doc *)aaStack_1e50[0].seqtree);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7e7;
        aVar19.seqtree = (btree *)&(aVar19.seqtree)->vsize;
      } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar16.seqtree != aVar19.seqtree);
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b711;
      fVar2 = fdb_commit(pfStack_1f08,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b800;
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b723;
      fdb_close(pfStack_1f08);
      lVar15 = 0;
      do {
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b732;
        fdb_doc_free((fdb_doc *)aaStack_1e50[lVar15].seqtree);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x14);
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b74a;
      fVar2 = fdb_free_snap_markers((fdb_snapshot_info_t *)pfStack_1ef0,(uint64_t)pfStack_1ef8);
      aVar19 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x14;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b757;
        fdb_shutdown();
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b75c;
        memleak_end();
        pcVar30 = "single kv mode:";
        if ((char)iStack_1efc != '\0') {
          pcVar30 = "multiple kv mode:";
        }
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b78c;
        sprintf(acStack_1bb0,"rollback all test %s",pcVar30);
        pcVar30 = "%s PASSED\n";
        if (rollback_all_test(bool)::__test_pass != '\0') {
          pcVar30 = "%s FAILED\n";
        }
        aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7b9;
        iVar4 = fprintf(_stderr,pcVar30,acStack_1bb0);
        return iVar4;
      }
      goto LAB_0011b805;
    }
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b80a;
    aVar19 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x0;
    do {
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4ce;
      fdb_kvs_close((fdb_kvs_handle *)aaStack_1ee0[(long)aVar19].seqtree);
      aVar19.seqtree = aVar19.seqtree + 1;
    } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar16.seqtree != aVar19.seqtree);
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4f2;
    fVar2 = fdb_open((fdb_file_handle **)&fStack_1e90,"./mvcc_test6",
                     (fdb_config *)(acStack_1bb0 + 0x100));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b80f;
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b518;
    fVar2 = fdb_kvs_open((fdb_file_handle *)fStack_1e90.name,(fdb_kvs_handle **)&aStack_1ee8.seqtree
                         ,"kv0",(fdb_kvs_config *)(acStack_1eb0 + 8));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b814;
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b533;
    fVar2 = fdb_rollback_all(pfStack_1f08,(fdb_snapshot_marker_t)pfStack_1ef0->kvs);
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b819;
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b546;
    fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_1ee8.seqtree);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b81e;
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b55b;
    fVar2 = fdb_close((fdb_file_handle *)fStack_1e90.name);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b576;
      fVar2 = fdb_rollback_all(pfStack_1f08,(fdb_snapshot_marker_t)pfStack_1ef0->kvs);
      unaff_R13.seqtree = (btree *)aaStack_1ee0;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcVar30 = acStack_1eb0;
        pcVar26 = "rollback_all_test";
        aVar19.seqtree = (btree *)0x0;
        handle_00 = aVar16;
        do {
          aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5a7;
          sprintf(pcVar30,"kv%d",aVar19.seqtree);
          aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5bc;
          fVar2 = fdb_kvs_open(pfStack_1f08,(fdb_kvs_handle **)unaff_R13.seqtree,pcVar30,
                               (fdb_kvs_config *)(acStack_1eb0 + 8));
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7f1;
          aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5d7;
          fVar2 = fdb_set_log_callback
                            ((fdb_kvs_handle *)
                             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                             &(unaff_R13.seqtree)->ksize)->seqtree,logCallbackFunc,
                             "rollback_all_test");
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7ec;
          aVar19._0_4_ = aVar19._0_4_ + 1;
          aVar19._4_4_ = 0;
          unaff_R13.seqtree = (btree *)&(unaff_R13.seqtree)->root_bid;
          handle_00.seqtree = (btree *)((long)(handle_00.seqtree + -1) + 0x37);
        } while (handle_00.seqtree != (btree *)0x0);
        goto LAB_0011b5f4;
      }
      goto LAB_0011b7fb;
    }
  }
  else {
LAB_0011b7f6:
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7fb;
    rollback_all_test();
LAB_0011b7fb:
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b800;
    rollback_all_test();
LAB_0011b800:
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b805;
    rollback_all_test();
LAB_0011b805:
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b80a;
    rollback_all_test();
LAB_0011b80a:
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b80f;
    rollback_all_test();
LAB_0011b80f:
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b814;
    rollback_all_test();
LAB_0011b814:
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b819;
    rollback_all_test();
LAB_0011b819:
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b81e;
    rollback_all_test();
LAB_0011b81e:
    aStack_1f18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b823;
    rollback_all_test();
  }
  aStack_1f18.seqtree = (btree *)auto_compaction_snapshots_test;
  rollback_all_test();
  aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b845;
  aStack_1f40 = aVar19;
  aStack_1f38 = handle_00;
  aStack_1f30 = unaff_R13;
  phStack_1f28 = (hbtrie_func_readkey *)pcVar26;
  aStack_1f20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar30;
  aStack_1f18 = aVar16;
  gettimeofday(&tStack_2098,(__timezone_ptr_t)0x0);
  aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b84a;
  memleak_start();
  puVar27 = &uStack_20dc;
  uStack_20dc = 0;
  aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b862;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig.seqtree = (btree *)auStack_2038;
  aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b872;
  fdb_get_default_config();
  uStack_200a = 1;
  uStack_2018 = 1;
  pcStack_1fe0 = compaction_cb_count;
  uStack_1fd8 = 0x20;
  uStack_2000 = 1;
  aVar19.seqtree = (btree *)0x155054;
  aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8ac;
  puStack_1fd0 = puVar27;
  fVar2 = fdb_open(&pfStack_20e8,"mvcc_test1",(fdb_config *)fconfig.seqtree);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig.seqtree = (btree *)afStack_20d8;
    aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8c1;
    fdb_get_default_kvs_config();
    fStack_2088.custom_cmp_param = afStack_20d8[0].custom_cmp_param;
    fStack_2088.create_if_missing = afStack_20d8[0].create_if_missing;
    fStack_2088._1_7_ = afStack_20d8[0]._1_7_;
    fStack_2088.custom_cmp = afStack_20d8[0].custom_cmp;
    aVar19.seqtree = (btree *)&aStack_20f0;
    aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8e6;
    fVar2 = fdb_kvs_open_default(pfStack_20e8,(fdb_kvs_handle **)aVar19.seqtree,&fStack_2088);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbcd;
    unaff_R13.seqtree = (btree *)0x155958;
    handle_00.seqtree = (btree *)0x0;
    do {
      pcVar30 = (char *)0xcccccccd;
      aVar17.seqtree = (btree *)0x1555bd;
      aVar19.seqtree = (btree *)afStack_20d8;
      iVar4 = handle_00._0_4_;
      aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b91a;
      sprintf((char *)aVar19.seqtree,"%d",handle_00.seqtree);
      aVar16 = aStack_20f0;
      aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b927;
      sVar6 = strlen((char *)aVar19.seqtree);
      aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b93e;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar16.seqtree,aVar19.seqtree,sVar6,"value",5);
      aVar18.seqtree = unaff_R13.seqtree;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb86;
        auto_compaction_snapshots_test();
LAB_0011bb86:
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb8b;
        auto_compaction_snapshots_test();
LAB_0011bb8b:
        fconfig = aVar16;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb90;
        auto_compaction_snapshots_test();
LAB_0011bb90:
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb95;
        auto_compaction_snapshots_test();
LAB_0011bb95:
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb9a;
        auto_compaction_snapshots_test();
        unaff_R13 = aVar18;
        doc_02 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar30;
LAB_0011bb9a:
        aVar18 = unaff_R13;
        unaff_R13 = aVar17;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb9f;
        auto_compaction_snapshots_test();
LAB_0011bb9f:
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbac;
        auto_compaction_snapshots_test();
LAB_0011bbac:
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbb9;
        aVar19 = fconfig;
        auto_compaction_snapshots_test();
LAB_0011bbb9:
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbbe;
        auto_compaction_snapshots_test();
        aVar16 = unaff_R13;
        pcVar30 = (char *)doc_02;
LAB_0011bbbe:
        unaff_R13 = aVar18;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbc3;
        auto_compaction_snapshots_test();
LAB_0011bbc3:
        puVar27 = (uint *)afStack_20d8;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbc8;
        auto_compaction_snapshots_test();
        goto LAB_0011bbc8;
      }
      aVar16 = handle_00;
      if ((int)((ulong)handle_00.seqtree / 10) * 10 == iVar4) {
        aVar19.seqtree = (btree *)0x0;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b96a;
        fVar2 = fdb_commit(pfStack_20e8,'\0');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb86;
      }
      fconfig = handle_00;
      if ((int)((ulong)handle_00.seqtree / 100) * 100 == iVar4) {
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b99b;
        fVar2 = fdb_get_kvs_info((fdb_kvs_handle *)aStack_20f0.seqtree,&fStack_2068);
        fconfig = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)fStack_2068.last_seqnum;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb8b;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9bd;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_20f0.seqtree,&pfStack_20f8,
                                  fStack_2068.last_seqnum);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb95;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9e3;
        fdb_doc_create((fdb_doc **)&aStack_2100.seqtree,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        (aStack_2100.seqtrie)->btree_blk_ops = (btree_blk_ops *)fconfig;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9f6;
        fVar2 = fdb_get_byseq(pfStack_20f8,(fdb_doc *)aStack_2100.seqtree);
        aVar18 = aStack_2100;
        doc_02.seqtree = (btree *)pcVar30;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb9a;
        pcVar30 = (char *)(aStack_2100.seqtrie)->aux;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba17;
        sVar6 = strlen(&afStack_20d8[0].create_if_missing);
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba25;
        iVar3 = bcmp(pcVar30,afStack_20d8,sVar6);
        doc_02 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar30;
        if (iVar3 != 0) goto LAB_0011bb9f;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba35;
        fdb_doc_free((fdb_doc *)aVar18.seqtree);
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba3f;
        fVar2 = fdb_kvs_close(pfStack_20f8);
        aVar17.seqtree = unaff_R13.seqtree;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb90;
        aVar19.seqtree = (btree *)&pfStack_20f8;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba5d;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_20f0.seqtree,
                                  (fdb_kvs_handle **)aVar19.seqtree,0xffffffffffffffff);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbb9;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba83;
        fdb_doc_create((fdb_doc **)&aStack_2100.seqtree,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        (aStack_2100.seqtrie)->btree_blk_ops = (btree_blk_ops *)fconfig;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba96;
        aVar19 = aStack_2100;
        fVar2 = fdb_get_byseq(pfStack_20f8,(fdb_doc *)aStack_2100.seqtree);
        doc_02 = aStack_2100;
        aVar16.seqtree = unaff_R13.seqtree;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbbe;
        fconfig = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)(aStack_2100.seqtrie)->aux;
        aVar19.seqtree = (btree *)afStack_20d8;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bab4;
        sVar6 = strlen((char *)aVar19.seqtree);
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bac2;
        iVar3 = bcmp(fconfig.seqtree,aVar19.seqtree,sVar6);
        if (iVar3 != 0) goto LAB_0011bbac;
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bad2;
        fdb_doc_free((fdb_doc *)doc_02.seqtree);
        aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11badc;
        fVar2 = fdb_kvs_close(pfStack_20f8);
        pcVar30 = (char *)0xcccccccd;
        aVar16.seqtree = (btree *)0x1555bd;
        if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011baf4;
        goto LAB_0011bbc3;
      }
LAB_0011baf4:
      puVar27 = (uint *)afStack_20d8;
      pcVar30 = (char *)0xcccccccd;
      aVar16.seqtree = (btree *)0x1555bd;
      handle_00._0_4_ = iVar4 + 1;
      handle_00._4_4_ = 0;
    } while (handle_00._0_4_ != 100000);
    aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb0e;
    fVar2 = fdb_close(pfStack_20e8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbd2;
    aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb1b;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb28;
      memleak_end();
      aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb42;
      sprintf(&afStack_20d8[0].create_if_missing,"auto compaction completed %d times with snapshots"
              ,(ulong)uStack_20dc);
      pcVar30 = "%s PASSED\n";
      if (auto_compaction_snapshots_test()::__test_pass != '\0') {
        pcVar30 = "%s FAILED\n";
      }
      aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb6f;
      iVar4 = fprintf(_stderr,pcVar30,afStack_20d8);
      return iVar4;
    }
  }
  else {
LAB_0011bbc8:
    aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbcd;
    auto_compaction_snapshots_test();
LAB_0011bbcd:
    aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbd2;
    auto_compaction_snapshots_test();
LAB_0011bbd2:
    aStack_2110 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbd7;
    auto_compaction_snapshots_test();
  }
  aStack_2110.seqtree = (btree *)compaction_cb_count;
  auto_compaction_snapshots_test();
  aVar18.seqtree = aVar19.seqtree & 0xffffffff;
  __tv = &tStack_2128;
  aStack_2138 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbf3;
  aStack_2118 = fconfig;
  aStack_2110 = aVar16;
  gettimeofday(__tv,(__timezone_ptr_t)0x0);
  if (aVar19._0_4_ == 0x20) {
    if (extraout_RDX == 0) {
      *(int *)&(aStack_2100.seqtree)->ksize = *(int *)&(aStack_2100.seqtree)->ksize + 1;
      return 0;
    }
  }
  else {
    aStack_2138 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc12;
    compaction_cb_count();
  }
  aStack_2138.seqtree = (btree *)rollback_during_ops_test;
  compaction_cb_count();
  aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc37;
  aStack_2158 = handle_00;
  aStack_2150 = unaff_R13;
  puStack_2148 = puVar27;
  aStack_2140 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar30;
  aStack_2138.seqtree = aVar18.seqtree;
  gettimeofday((timeval *)(acStack_238f + 0x2f),(__timezone_ptr_t)0x0);
  aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc3c;
  memleak_start();
  uStack_239c = 10000;
  if (__tv == (timeval *)0x0) {
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc59;
    system("rm -rf  mvcc_test* > errorlog.txt");
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc66;
    fdb_get_default_config();
    fconfig_01 = &fStack_2258;
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc7e;
    memcpy(fconfig_01,auStack_2350,0xf8);
    fStack_2258.block_reusing_threshold = 0;
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc9d;
    fVar2 = fdb_open(&pfStack_23a8,"mvcc_test1",fconfig_01);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bcb2;
      fdb_get_default_kvs_config();
      uStack_2368 = uStack_2340;
      pcStack_2378 = (char *)auStack_2350._0_8_;
      pfStack_2370 = (fdb_config *)auStack_2350._8_8_;
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bcd4;
      fVar2 = fdb_kvs_open_default
                        (pfStack_23a8,(fdb_kvs_handle **)&aStack_23b0.seqtree,
                         (fdb_kvs_config *)(acStack_238f + 0x17));
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0df;
      unaff_R13._0_1_ = 1;
      __tv = (timeval *)0x1;
      uVar13 = 0;
      do {
        aVar18._0_4_ = uVar13 + 1;
        aVar18._4_4_ = 0;
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd03;
        sprintf(acStack_238f,"%d",aVar18.seqtree);
        handle_00 = aStack_23b0;
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd10;
        sVar6 = strlen(acStack_238f);
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd2b;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)handle_00.seqtree,acStack_238f,sVar6,"value",5);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfab;
          rollback_during_ops_test();
          goto LAB_0011bfab;
        }
        if ((int)((ulong)__tv / 10) * 10 - 1U == uVar13) {
          unaff_R13.seqtree = unaff_R13.seqtree ^ 1;
          aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd66;
          fdb_commit(pfStack_23a8,unaff_R13._0_1_);
        }
        __tv = (timeval *)(ulong)((int)__tv + 1);
        uVar13 = aVar18._0_4_;
      } while (aVar18._0_4_ < 10000);
      aVar18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd8b;
      fdb_commit(pfStack_23a8,'\x01');
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd9a;
      fdb_get_kvs_info((fdb_kvs_handle *)aStack_23b0.seqtree,(fdb_kvs_info *)auStack_2350);
      __tv = (timeval *)(auStack_2350 + 8);
      if ((fdb_config *)auStack_2350._8_8_ != (fdb_config *)0x2710) {
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdb0;
        rollback_during_ops_test();
      }
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdc8;
      pthread_create(&pStack_2398,(pthread_attr_t *)0x0,rollback_during_ops_test,&uStack_239c);
      fconfig_01 = (fdb_config *)0x155958;
      pcVar30 = acStack_238f;
      handle_00.seqtree = (btree *)0x1555bd;
      do {
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdea;
        sprintf(pcVar30,"%d",aVar18.seqtree);
        unaff_R13 = aStack_23b0;
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdf7;
        sVar6 = strlen(pcVar30);
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be0e;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)unaff_R13.seqtree,pcVar30,sVar6,"value",5);
        if (fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) {
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfab;
          aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be2a;
          fVar2 = fdb_commit(pfStack_23a8,'\x01');
          if ((fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) && (fVar2 != FDB_RESULT_SUCCESS))
          goto LAB_0011bfb0;
        }
        aVar18._0_4_ = aVar18._0_4_ + 1;
        aVar18._4_4_ = 0;
      } while (aVar18._0_4_ != 0x2711);
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be50;
      pthread_join(pStack_2398,(void **)(acStack_238f + 0xf));
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be73;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_23b0.seqtree,"key1",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e4;
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be8a;
      fVar2 = fdb_commit(pfStack_23a8,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e9;
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bea4;
      fdb_get_kvs_info((fdb_kvs_handle *)aStack_23b0.seqtree,(fdb_kvs_info *)auStack_2350);
      fconfig_01 = (fdb_config *)auStack_2350._8_8_;
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11becb;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_23b0.seqtree,"key2",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0ee;
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bef6;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_23b0.seqtree,"key3",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0f3;
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf0d;
      fVar2 = fdb_commit(pfStack_23a8,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0f8;
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf22;
      fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_23b0.seqtree,(fdb_seqnum_t)fconfig_01);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf3c;
        fdb_get_kvs_info((fdb_kvs_handle *)aStack_23b0.seqtree,(fdb_kvs_info *)auStack_2350);
        if ((fdb_config *)auStack_2350._8_8_ != fconfig_01) {
          aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf4d;
          rollback_during_ops_test();
        }
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf57;
        fdb_close(pfStack_23a8);
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf5c;
        fdb_shutdown();
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf61;
        memleak_end();
        pcVar30 = "%s PASSED\n";
        if (rollback_during_ops_test(void*)::__test_pass != '\0') {
          pcVar30 = "%s FAILED\n";
        }
        aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf92;
        fprintf(_stderr,pcVar30,"rollback during ops test");
        return 0;
      }
    }
    else {
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0df;
      rollback_during_ops_test();
LAB_0011c0df:
      __tv = (timeval *)auStack_2350;
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0e4;
      rollback_during_ops_test();
LAB_0011c0e4:
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0e9;
      rollback_during_ops_test();
LAB_0011c0e9:
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0ee;
      rollback_during_ops_test();
LAB_0011c0ee:
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0f3;
      rollback_during_ops_test();
LAB_0011c0f3:
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0f8;
      rollback_during_ops_test();
LAB_0011c0f8:
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0fd;
      rollback_during_ops_test();
    }
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c102;
    rollback_during_ops_test();
LAB_0011c102:
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c107;
    rollback_during_ops_test();
  }
  else {
LAB_0011bfb5:
    fconfig_01 = (fdb_config *)auStack_2350;
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfc2;
    fdb_get_default_config();
    pcVar30 = (char *)&fStack_2258;
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfda;
    memcpy(pcVar30,fconfig_01,0xf8);
    fStack_2258.block_reusing_threshold = 0;
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bff9;
    fVar2 = fdb_open(&pfStack_23a8,"mvcc_test1",(fdb_config *)pcVar30);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c102;
    fconfig_01 = (fdb_config *)auStack_2350;
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c00e;
    fdb_get_default_kvs_config();
    uStack_2368 = uStack_2340;
    pcStack_2378 = (char *)auStack_2350._0_8_;
    pfStack_2370 = (fdb_config *)auStack_2350._8_8_;
    aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c031;
    fVar2 = fdb_kvs_open_default
                      (pfStack_23a8,(fdb_kvs_handle **)&aStack_23b0.seqtree,
                       (fdb_kvs_config *)(acStack_238f + 0x17));
    if (fVar2 == FDB_RESULT_SUCCESS) {
      __tv = (timeval *)(long)(int)__tv->tv_sec;
      if (1 < (long)__tv) {
        unaff_R13.seqtree = (btree *)0xcccccccd;
        fconfig_01 = (fdb_config *)0x155958;
        pcVar30 = acStack_238f;
        handle_00.seqtree = (btree *)0x1555bd;
        do {
          aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c06e;
          sprintf(pcVar30,"%d",(ulong)__tv & 0xffffffff);
          aVar18 = aStack_23b0;
          aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c07b;
          sVar6 = strlen(pcVar30);
          aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c092;
          fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar18.seqtree,pcVar30,sVar6,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c10c;
          if ((int)(((ulong)__tv & 0xffffffff) / 10) * -10 + (int)__tv == 0) {
            aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0b8;
            fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_23b0.seqtree,(fdb_seqnum_t)__tv);
            if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c111;
          }
          bVar1 = 2 < (long)__tv;
          __tv = (timeval *)((long)&__tv[-1].tv_usec + 7);
        } while (bVar1);
      }
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0d3;
      fdb_close(pfStack_23a8);
      aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0da;
      pthread_exit((void *)0x0);
    }
  }
  aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c10c;
  rollback_during_ops_test();
LAB_0011c10c:
  aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c111;
  rollback_during_ops_test();
LAB_0011c111:
  aStack_23c0.seqtree = (btree *)in_memory_snapshot_rollback_test;
  rollback_during_ops_test();
  aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c132;
  ptStack_23e0 = __tv;
  aStack_23d8 = handle_00;
  aStack_23d0 = unaff_R13;
  pfStack_23c8 = fconfig_01;
  aStack_23c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar30;
  gettimeofday((timeval *)(auStack_253f + 0xf),(__timezone_ptr_t)0x0);
  aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c137;
  memleak_start();
  aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c143;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00 = &fStack_24d8;
  aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c153;
  fdb_get_default_config();
  aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c167;
  fVar2 = fdb_open(&pfStack_2560,"mvcc_test1",fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_00 = (fdb_config *)(auStack_2520 + 0x30);
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c17f;
    fdb_get_default_kvs_config();
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c191;
    fVar2 = fdb_kvs_open_default
                      (pfStack_2560,(fdb_kvs_handle **)&aStack_2568.seqtree,
                       (fdb_kvs_config *)fconfig_00);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3b2;
    fconfig_00 = (fdb_config *)0x1;
    fconfig_01 = (fdb_config *)0x155958;
    pcVar30 = auStack_253f;
    handle_00.seqtree = (btree *)0x1555bd;
    do {
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1c0;
      sprintf(pcVar30,"%d",fconfig_00);
      unaff_R13 = aStack_2568;
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1cd;
      sVar6 = strlen(pcVar30);
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1e4;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)unaff_R13.seqtree,pcVar30,sVar6,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3a8;
        in_memory_snapshot_rollback_test();
        goto LAB_0011c3a8;
      }
      uVar13 = (int)fconfig_00 + 1;
      fconfig_00 = (fdb_config *)(ulong)uVar13;
    } while (uVar13 != 4);
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1ff;
    fdb_commit(pfStack_2560,'\0');
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c222;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2568.seqtree,"key4",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3b7;
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c24d;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2568.seqtree,"key5",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3bc;
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c264;
    fVar2 = fdb_commit(pfStack_2560,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3c1;
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c27b;
    fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_2568.seqtree,3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3c6;
    fconfig_00 = (fdb_config *)auStack_2520;
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c295;
    fdb_get_kvs_info((fdb_kvs_handle *)aStack_2568.seqtree,(fdb_kvs_info *)fconfig_00);
    if (auStack_2520._8_8_ != 3) {
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c2a6;
      in_memory_snapshot_rollback_test();
    }
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c2bc;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_2568.seqtree,&pfStack_2548,0xffffffffffffffff
                             );
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3cb;
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c2e4;
    fdb_iterator_init(pfStack_2548,&pfStack_2558,(void *)0x0,0,(void *)0x0,0,0);
    fconfig_00 = (fdb_config *)&pfStack_2550;
    pfStack_2550 = (fdb_doc *)0x0;
    fconfig_01 = (fdb_config *)0x3;
    do {
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c303;
      fVar2 = fdb_iterator_get(pfStack_2558,(fdb_doc **)fconfig_00);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3a8;
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c315;
      fdb_doc_free(pfStack_2550);
      pfStack_2550 = (fdb_doc *)0x0;
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c328;
      fVar2 = fdb_iterator_next(pfStack_2558);
      fconfig_01 = (fdb_config *)&fconfig_01[-1].field_0xf7;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (fconfig_01 == (fdb_config *)0x0) {
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c343;
      fdb_iterator_close(pfStack_2558);
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c34d;
      fdb_kvs_close(pfStack_2548);
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c357;
      fdb_close(pfStack_2560);
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c35c;
      fdb_shutdown();
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c361;
      memleak_end();
      pcVar30 = "%s PASSED\n";
      if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
        pcVar30 = "%s FAILED\n";
      }
      aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c392;
      iVar4 = fprintf(_stderr,pcVar30,"in-memory snapshot rollback test");
      return iVar4;
    }
  }
  else {
LAB_0011c3ad:
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3b2;
    in_memory_snapshot_rollback_test();
LAB_0011c3b2:
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3b7;
    in_memory_snapshot_rollback_test();
LAB_0011c3b7:
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3bc;
    in_memory_snapshot_rollback_test();
LAB_0011c3bc:
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3c1;
    in_memory_snapshot_rollback_test();
LAB_0011c3c1:
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3c6;
    in_memory_snapshot_rollback_test();
LAB_0011c3c6:
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3cb;
    in_memory_snapshot_rollback_test();
LAB_0011c3cb:
    aStack_2578 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3d0;
    in_memory_snapshot_rollback_test();
  }
  aStack_2578.seqtree = (btree *)rollback_drop_multi_files_kvs_test;
  in_memory_snapshot_rollback_test();
  pcStack_4a30 = (code *)0x11c3f2;
  pfStack_25a0 = fconfig_00;
  aStack_2598 = handle_00;
  aStack_2590 = unaff_R13;
  pfStack_2588 = fconfig_01;
  aStack_2580 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar30;
  aStack_2578 = aVar18;
  gettimeofday(&tStack_49b8,(__timezone_ptr_t)0x0);
  pcStack_4a30 = (code *)0x11c3f7;
  memleak_start();
  pcStack_4a30 = (code *)0x11c403;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_4a30 = (code *)0x11c413;
  fdb_get_default_config();
  pcStack_4a30 = (code *)0x11c41d;
  fdb_get_default_kvs_config();
  fStack_48a0.wal_threshold = 0x400;
  fStack_48a0.compaction_mode = 0;
  fStack_48a0.durability_opt = 2;
  pfVar9 = (fdb_kvs_handle *)(apfStack_46a8 + 0x20);
  ppfVar12 = apfStack_49a8;
  pcVar30 = "kvs%d";
  uVar5 = 0;
  ppfVar28 = (fdb_kvs_handle **)0x0;
  do {
    pcStack_4a30 = (code *)0x11c45d;
    sprintf((char *)ppfVar12,"mvcc_test%d",(ulong)ppfVar28 & 0xffffffff);
    pcVar26 = (char *)(apfStack_4a18 + (long)ppfVar28);
    pcStack_4a30 = (code *)0x11c478;
    ppfVar23 = (fdb_kvs_handle **)pcVar26;
    fVar2 = fdb_open((fdb_file_handle **)pcVar26,(char *)ppfVar12,
                     (fdb_config *)(apfStack_49a8 + 0x21));
    iVar4 = (int)ppfVar23;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7c7;
    ppfVar23 = (fdb_kvs_handle **)0x0;
    ppfStack_4a28 = ppfVar28;
    pfStack_4a20 = pfVar9;
    do {
      ppfVar28 = ppfVar23;
      pcStack_4a30 = (code *)0x11c49d;
      sprintf((char *)ppfVar12,"kvs%d",(ulong)(uint)((int)ppfVar28 + (int)uVar5));
      pfVar31 = *(fdb_kvs_handle **)pcVar26;
      pcStack_4a30 = (code *)0x11c4b0;
      fVar2 = fdb_kvs_open((fdb_file_handle *)pfVar31,(fdb_kvs_handle **)pfVar9,(char *)ppfVar12,
                           (fdb_kvs_config *)(apfStack_4a18 + 9));
      iVar4 = (int)pfVar31;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_4a30 = (code *)0x11c7bd;
        rollback_drop_multi_files_kvs_test();
        goto LAB_0011c7bd;
      }
      pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).custom_cmp;
      ppfVar23 = (fdb_kvs_handle **)((long)ppfVar28 + 1);
    } while ((char *)((long)ppfVar28 + 1) != (char *)0x80);
    ppfVar28 = (fdb_kvs_handle **)((long)ppfStack_4a28 + 1);
    uVar5 = uVar5 + 0x80;
    pfVar9 = (fdb_kvs_handle *)&pfStack_4a20[1].bub_ctx.space_used;
  } while (ppfVar28 != (fdb_kvs_handle **)0x8);
  ppfVar28 = apfStack_49a8 + 0x40;
  ppfVar12 = apfStack_46a8;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    uVar5 = 0;
    do {
      pcStack_4a30 = (code *)0x11c511;
      sprintf((char *)ppfVar28,"key%08d",uVar5);
      pcStack_4a30 = (code *)0x11c524;
      sprintf((char *)ppfVar12,"value%08d",uVar5);
      pcVar30 = (char *)apfStack_46a8[(long)&pfVar9->op_stats];
      pcStack_4a30 = (code *)0x11c534;
      sVar6 = strlen((char *)ppfVar28);
      pcVar26 = (char *)(sVar6 + 1);
      pcStack_4a30 = (code *)0x11c540;
      sVar6 = strlen((char *)ppfVar12);
      pcStack_4a30 = (code *)0x11c555;
      pfVar31 = (fdb_kvs_handle *)pcVar30;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar30,ppfVar28,(size_t)pcVar26,ppfVar12,sVar6 + 1);
      iVar4 = (int)pfVar31;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7bd;
      uVar13 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar13;
    } while (uVar13 != 10);
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x400);
  pcVar26 = (char *)0x0;
  do {
    pfVar31 = apfStack_4a18[(long)pcVar26];
    if (((ulong)pcVar26 & 1) == 0) {
      pcStack_4a30 = (code *)0x11c583;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar31,'\0');
      iVar4 = (int)pfVar31;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7e5;
    }
    else {
      pcStack_4a30 = (code *)0x11c596;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar31,'\x01');
      iVar4 = (int)pfVar31;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7ea;
    }
    pcVar26 = (char *)((long)pcVar26 + 1);
  } while (pcVar26 != (char *)0x8);
  pcVar26 = "key%08d";
  ppfVar28 = apfStack_49a8 + 0x40;
  ppfVar12 = (fdb_kvs_handle **)0x0;
  do {
    uVar5 = 0;
    do {
      pcStack_4a30 = (code *)0x11c5ca;
      sprintf((char *)ppfVar28,"key%08d",uVar5);
      pfVar9 = apfStack_46a8[(long)(ppfVar12 + 4)];
      pcStack_4a30 = (code *)0x11c5da;
      sVar6 = strlen((char *)ppfVar28);
      pcStack_4a30 = (code *)0x11c5e9;
      pfVar31 = pfVar9;
      fVar2 = fdb_del_kv(pfVar9,ppfVar28,sVar6 + 1);
      iVar4 = (int)pfVar31;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7c2;
      uVar13 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar13;
    } while (uVar13 != 10);
    ppfVar12 = (fdb_kvs_handle **)((long)ppfVar12 + 1);
  } while (ppfVar12 != (fdb_kvs_handle **)0x400);
  pcVar26 = (char *)0x0;
  do {
    pfVar31 = apfStack_4a18[(long)pcVar26];
    if (((ulong)pcVar26 & 1) == 0) {
      pcStack_4a30 = (code *)0x11c617;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar31,'\0');
      iVar4 = (int)pfVar31;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7ef;
    }
    else {
      pcStack_4a30 = (code *)0x11c62a;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar31,'\x01');
      iVar4 = (int)pfVar31;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7f4;
    }
    pcVar26 = (char *)((long)pcVar26 + 1);
  } while (pcVar26 != (char *)0x8);
  ppfVar28 = (fdb_kvs_handle **)0xffffffffffffffc0;
  pcVar26 = (char *)(apfStack_46a8 + 0x20);
  do {
    pcStack_4a30 = (code *)0x11c657;
    ppfVar23 = (fdb_kvs_handle **)pcVar26;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar26,10);
    iVar4 = (int)ppfVar23;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7cc;
    ppfVar28 = ppfVar28 + 8;
    pcVar26 = (char *)((long)pcVar26 + 0x200);
  } while (ppfVar28 < (fdb_kvs_handle **)0x3c0);
  ppfVar12 = apfStack_4a18;
  pcVar26 = "kvs%d";
  ppfVar28 = apfStack_49a8;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pfVar31 = apfStack_46a8[(long)&pfVar9->op_stats];
    pcStack_4a30 = (code *)0x11c697;
    fVar2 = fdb_kvs_close(pfVar31);
    iVar4 = (int)pfVar31;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7d6;
    pcStack_4a30 = (code *)0x11c6af;
    sprintf((char *)ppfVar28,"kvs%d",(ulong)pfVar9 & 0xffffffff);
    pfVar31 = *ppfVar12;
    pcStack_4a30 = (code *)0x11c6bb;
    fVar2 = fdb_kvs_remove((fdb_file_handle *)pfVar31,(char *)ppfVar28);
    iVar4 = (int)pfVar31;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7d1;
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->config).wal_threshold;
    ppfVar12 = ppfVar12 + 1;
  } while (pfVar9 != (fdb_kvs_handle *)0x400);
  pcVar26 = (char *)0x0;
  do {
    pfVar31 = apfStack_4a18[(long)pcVar26];
    if (((ulong)pcVar26 & 1) == 0) {
      pcStack_4a30 = (code *)0x11c6e7;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar31,'\0');
      iVar4 = (int)pfVar31;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7f9;
    }
    else {
      pcStack_4a30 = (code *)0x11c6fa;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar31,'\x01');
      iVar4 = (int)pfVar31;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7fe;
    }
    pcVar26 = (char *)((long)pcVar26 + 1);
  } while (pcVar26 != (char *)0x8);
  pcVar26 = "mvcc_test_compact%d";
  ppfVar28 = apfStack_49a8;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_4a30 = (code *)0x11c72d;
    sprintf((char *)ppfVar28,"mvcc_test_compact%d",(ulong)pfVar9 & 0xffffffff);
    pfVar31 = apfStack_4a18[(long)pfVar9];
    pcStack_4a30 = (code *)0x11c73a;
    fVar2 = fdb_compact((fdb_file_handle *)pfVar31,(char *)ppfVar28);
    iVar4 = (int)pfVar31;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7db;
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x8);
  pcVar26 = (char *)0x0;
  pcStack_4a30 = (code *)0x11c754;
  fdb_doc_free((fdb_doc *)0x0);
  while( true ) {
    pfVar31 = apfStack_4a18[(long)pcVar26];
    pcStack_4a30 = (code *)0x11c75e;
    fVar2 = fdb_close((fdb_file_handle *)pfVar31);
    iVar4 = (int)pfVar31;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pcVar26 = (char *)((long)pcVar26 + 1);
    if (pcVar26 == (char *)0x8) {
      pcStack_4a30 = (code *)0x11c770;
      fdb_shutdown();
      pcStack_4a30 = (code *)0x11c775;
      memleak_end();
      pcVar30 = "%s PASSED\n";
      if (rollback_drop_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar30 = "%s FAILED\n";
      }
      pcStack_4a30 = (code *)0x11c7a6;
      iVar4 = fprintf(_stderr,pcVar30,"open multi files kvs test");
      return iVar4;
    }
  }
LAB_0011c7e0:
  pcStack_4a30 = (code *)0x11c7e5;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7e5:
  pcStack_4a30 = (code *)0x11c7ea;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7ea:
  pcStack_4a30 = (code *)0x11c7ef;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7ef:
  pcStack_4a30 = (code *)0x11c7f4;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7f4:
  pcStack_4a30 = (code *)0x11c7f9;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7f9:
  pcStack_4a30 = (code *)0x11c7fe;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7fe:
  pcStack_4a30 = rollback_without_seqtree;
  rollback_drop_multi_files_kvs_test();
  pcStack_4f38 = (code *)0x11c825;
  ppfStack_4a58 = (fdb_kvs_handle **)pcVar26;
  ppfStack_4a50 = ppfVar12;
  pfStack_4a48 = (fdb_kvs_handle *)pcVar30;
  ppfStack_4a40 = ppfVar28;
  pfStack_4a38 = pfVar9;
  pcStack_4a30 = (code *)uVar5;
  gettimeofday(&tStack_4eb0,(__timezone_ptr_t)0x0);
  pcStack_4f38 = (code *)0x11c82a;
  memleak_start();
  pcStack_4f38 = (code *)0x11c83a;
  fdb_get_default_config();
  pcStack_4f38 = (code *)0x11c844;
  fdb_get_default_kvs_config();
  fStack_4b50.flags = 1;
  fStack_4b50.block_reusing_threshold = 0;
  fStack_4b50.seqtree_opt = 0;
  pcStack_4f38 = (code *)0x11c86a;
  fStack_4b50.multi_kv_instances = (bool)(char)iVar4;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_4f38 = (code *)0x11c87e;
  fdb_open((fdb_file_handle **)&pfStack_4f20,"./mvcc_test1",(fdb_config *)(acStack_4c50 + 0x100));
  iStack_4efc = iVar4;
  if (iVar4 == 0) {
    pcStack_4f38 = (code *)0x11c8ea;
    fdb_kvs_open_default((fdb_file_handle *)pfStack_4f20,apfStack_4ef0,&fStack_4ed0);
    pcVar30 = (char *)0x1;
  }
  else {
    ppfVar12 = apfStack_4ef0;
    uVar5 = 0;
    do {
      pcStack_4f38 = (code *)0x11c8af;
      sprintf(acStack_4eb8,"kv%d",uVar5 & 0xffffffff);
      pcStack_4f38 = (code *)0x11c8c2;
      fdb_kvs_open((fdb_file_handle *)pfStack_4f20,ppfVar12,acStack_4eb8,&fStack_4ed0);
      uVar5 = uVar5 + 1;
      ppfVar12 = ppfVar12 + 1;
    } while (uVar5 != 3);
    pcVar30 = (char *)0x3;
  }
  uStack_4f24 = 0;
  do {
    uVar5 = 0;
    do {
      pcStack_4f38 = (code *)0x11c916;
      sprintf(acStack_4d50,"key%d",uVar5 & 0xffffffff);
      pcStack_4f38 = (code *)0x11c937;
      sprintf(acStack_4ea0,"meta-%d-%d",(ulong)uStack_4f24,uVar5 & 0xffffffff);
      pcStack_4f38 = (code *)0x11c956;
      sprintf(acStack_4c50,"body-%d-%d",(ulong)uStack_4f24,uVar5 & 0xffffffff);
      doc_00 = (btree *)(&bStack_4da0.ksize + uVar5 * 8);
      pcStack_4f38 = (code *)0x11c969;
      sVar6 = strlen(acStack_4d50);
      pcStack_4f38 = (code *)0x11c979;
      metalen._M_i = strlen(acStack_4ea0);
      pcStack_4f38 = (code *)0x11c984;
      sVar7 = strlen(acStack_4c50);
      pcStack_4f38 = (code *)0x11c9a9;
      fdb_doc_create((fdb_doc **)doc_00,acStack_4d50,sVar6,acStack_4ea0,metalen._M_i,acStack_4c50,
                     sVar7);
      pfVar9 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_4f38 = (code *)0x11c9ba;
        fdb_set(apfStack_4ef0[(long)pfVar9],*(fdb_doc **)doc_00);
        pfVar9 = (fdb_kvs_handle *)((long)pfVar9 + 1);
      } while ((fdb_kvs_handle *)pcVar30 != pfVar9);
      pcStack_4f38 = (code *)0x11c9cf;
      fdb_doc_free(*(fdb_doc **)(&bStack_4da0.ksize + uVar5 * 8));
      uVar5 = uVar5 + 1;
    } while (uVar5 != 10);
    pcStack_4f38 = (code *)0x11c9f3;
    fdb_commit((fdb_file_handle *)pfStack_4f20,~(byte)uStack_4f24 & 1);
    uStack_4f24 = uStack_4f24 + 1;
    pcVar26 = (char *)(ulong)uStack_4f24;
  } while (uStack_4f24 != 5);
  pcStack_4f38 = (code *)0x11ca16;
  fVar2 = fdb_get_all_snap_markers((fdb_file_handle *)pfStack_4f20,&pfStack_4f08,&uStack_4ed8);
  pfVar31 = (fdb_kvs_handle *)0xa;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_4f38 = (code *)0x11ca35;
    fVar2 = fdb_rollback(apfStack_4ef0,(pfStack_4f08[3].kvs_markers)->seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd19;
    pfStack_4f18 = (fdb_kvs_handle *)0x0;
    pcVar26 = acStack_4c50;
    pfVar31 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_4f38 = (code *)0x11ca6a;
      fVar2 = fdb_snapshot_open(apfStack_4ef0[(long)pfVar31],&pfStack_4ef8,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccfb:
        pcStack_4f38 = (code *)0x11cd00;
        rollback_without_seqtree();
LAB_0011cd00:
        pcStack_4f38 = (code *)0x11cd05;
        rollback_without_seqtree();
LAB_0011cd05:
        pcStack_4f38 = (code *)0x11cd0a;
        rollback_without_seqtree();
LAB_0011cd0a:
        pcStack_4f38 = (code *)0x11cd0f;
        rollback_without_seqtree();
        goto LAB_0011cd0f;
      }
      pcStack_4f38 = (code *)0x11ca92;
      fVar2 = fdb_iterator_init(pfStack_4ef8,&pfStack_4f10,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccf6:
        pcStack_4f38 = (code *)0x11ccfb;
        rollback_without_seqtree();
        goto LAB_0011ccfb;
      }
      metalen._M_i = 0;
      do {
        pcStack_4f38 = (code *)0x11caac;
        fVar2 = fdb_iterator_get(pfStack_4f10,(fdb_doc **)&pfStack_4f18);
        if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccd1:
          pcStack_4f38 = (code *)0x11ccd6;
          rollback_without_seqtree();
LAB_0011ccd6:
          pcStack_4f38 = (code *)0x11cce6;
          rollback_without_seqtree();
LAB_0011cce6:
          pcStack_4f38 = (code *)0x11ccf6;
          rollback_without_seqtree();
          goto LAB_0011ccf6;
        }
        pcStack_4f38 = (code *)0x11cacd;
        sprintf(acStack_4d50,"key%d",metalen._M_i);
        if (pfVar31 == (fdb_kvs_handle *)0x0) {
          pcStack_4f38 = (code *)0x11cb1c;
          sprintf(acStack_4ea0,"meta-1-%d",metalen._M_i);
          pcStack_4f38 = (code *)0x11cb30;
          sprintf(pcVar26,"body-1-%d",metalen._M_i);
        }
        else {
          pcStack_4f38 = (code *)0x11caf0;
          sprintf(acStack_4ea0,"meta-%d-%d",4,metalen._M_i);
          pcStack_4f38 = (code *)0x11cb09;
          sprintf(pcVar26,"body-%d-%d",4);
        }
        pfVar9 = pfStack_4f18;
        doc_00 = (btree *)pfStack_4f18->op_stats;
        pcStack_4f38 = (code *)0x11cb4c;
        iVar4 = bcmp(doc_00,acStack_4d50,*(size_t *)&pfStack_4f18->kvs_config);
        if (iVar4 != 0) {
          pcStack_4f38 = (code *)0x11ccd1;
          rollback_without_seqtree();
          goto LAB_0011ccd1;
        }
        doc_00 = pfVar9->staletree;
        pcStack_4f38 = (code *)0x11cb6c;
        iVar4 = bcmp(doc_00,acStack_4ea0,(size_t)(pfVar9->kvs_config).custom_cmp);
        if (iVar4 != 0) goto LAB_0011cce6;
        doc_00 = (pfVar9->field_6).seqtree;
        pcStack_4f38 = (code *)0x11cb87;
        iVar4 = bcmp(doc_00,pcVar26,(size_t)(pfVar9->kvs_config).custom_cmp_param);
        if (iVar4 != 0) goto LAB_0011ccd6;
        pcStack_4f38 = (code *)0x11cb97;
        fdb_doc_free((fdb_doc *)pfVar9);
        pfStack_4f18 = (fdb_kvs_handle *)0x0;
        uVar13 = (int)metalen._M_i + 1;
        metalen._M_i = (__int_type)uVar13;
        pcStack_4f38 = (code *)0x11cbad;
        fVar2 = fdb_iterator_next(pfStack_4f10);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar13 != 10) goto LAB_0011cd00;
      pcStack_4f38 = (code *)0x11cbca;
      fVar2 = fdb_iterator_close(pfStack_4f10);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd05;
      pcStack_4f38 = (code *)0x11cbdc;
      fVar2 = fdb_kvs_close(pfStack_4ef8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd0a;
      pfVar31 = (fdb_kvs_handle *)&(pfVar31->kvs_config).field_0x1;
    } while (pfVar31 != (fdb_kvs_handle *)pcVar30);
    pcVar26 = (char *)0x0;
    do {
      pcStack_4f38 = (code *)0x11cbfc;
      fVar2 = fdb_kvs_close(apfStack_4ef0[(long)pcVar26]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd0f;
      pcVar26 = pcVar26 + 1;
    } while (pcVar30 != pcVar26);
    pcStack_4f38 = (code *)0x11cc1f;
    fVar2 = fdb_rollback_all((fdb_file_handle *)pfStack_4f20,pfStack_4f08[3].marker);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd1e;
    pcStack_4f38 = (code *)0x11cc36;
    fVar2 = fdb_free_snap_markers(pfStack_4f08,uStack_4ed8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_4f38 = (code *)0x11cc48;
      fdb_close((fdb_file_handle *)pfStack_4f20);
      pcStack_4f38 = (code *)0x11cc4d;
      fdb_shutdown();
      pcStack_4f38 = (code *)0x11cc52;
      memleak_end();
      pcVar30 = "single kv mode:";
      if ((char)iStack_4efc != '\0') {
        pcVar30 = "multiple kv mode:";
      }
      pcStack_4f38 = (code *)0x11cc82;
      sprintf(acStack_4c50,"rollback without seqtree in %s",pcVar30);
      pcVar30 = "%s PASSED\n";
      if (rollback_without_seqtree(bool)::__test_pass != '\0') {
        pcVar30 = "%s FAILED\n";
      }
      pcStack_4f38 = (code *)0x11ccaf;
      iVar4 = fprintf(_stderr,pcVar30,acStack_4c50);
      return iVar4;
    }
  }
  else {
LAB_0011cd14:
    pcStack_4f38 = (code *)0x11cd19;
    rollback_without_seqtree();
LAB_0011cd19:
    pcStack_4f38 = (code *)0x11cd1e;
    rollback_without_seqtree();
LAB_0011cd1e:
    pcStack_4f38 = (code *)0x11cd23;
    rollback_without_seqtree();
  }
  pcStack_4f38 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_5110 = (fdb_kvs_handle *)0x11cd45;
  pcStack_4f60 = pcVar26;
  aStack_4f58.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_4f50 = doc_00;
  pfStack_4f48 = pfVar9;
  pfStack_4f40 = pfVar31;
  pcStack_4f38 = (code *)pcVar30;
  gettimeofday(&tStack_50b0,(__timezone_ptr_t)0x0);
  pfStack_5110 = (fdb_kvs_handle *)0x11cd4a;
  memleak_start();
  pfStack_5110 = (fdb_kvs_handle *)0x11cd56;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar30 = auStack_50a0 + 0x48;
  pfStack_5110 = (fdb_kvs_handle *)0x11cd66;
  fdb_get_default_config();
  pfStack_5110 = (fdb_kvs_handle *)0x11cd78;
  fVar2 = fdb_open(&pfStack_5108,"./mvcc_test2",(fdb_config *)pcVar30);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar30 = auStack_50a0;
    pfStack_5110 = (fdb_kvs_handle *)0x11cd8d;
    fdb_get_default_kvs_config();
    pbStack_50b8 = (btreeblk_handle *)auStack_50a0._16_8_;
    pfStack_50c8 = (filemgr *)auStack_50a0._0_8_;
    pdStack_50c0 = (docio_handle *)auStack_50a0._8_8_;
    pfStack_5110 = (fdb_kvs_handle *)0x11cdae;
    fVar2 = fdb_kvs_open_default(pfStack_5108,&pfStack_5100,(fdb_kvs_config *)&pfStack_50c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0b9;
    pfStack_5110 = (fdb_kvs_handle *)0x11cdc4;
    fVar2 = fdb_begin_transaction(pfStack_5108,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0be;
    pcVar30 = "key%d";
    pfVar9 = (fdb_kvs_handle *)acStack_50f7;
    pfVar31 = (fdb_kvs_handle *)0x1555bd;
    uVar5 = 0;
    do {
      pfStack_5110 = (fdb_kvs_handle *)0x11cdf0;
      sprintf((char *)pfVar9,"key%d",uVar5);
      handle = pfStack_5100;
      pfStack_5110 = (fdb_kvs_handle *)0x11cdfd;
      sVar6 = strlen((char *)pfVar9);
      pfStack_5110 = (fdb_kvs_handle *)0x11ce14;
      fVar2 = fdb_set_kv(handle,pfVar9,sVar6,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_5110 = (fdb_kvs_handle *)0x11d0a5;
        tx_crash_recover_test();
        goto LAB_0011d0a5;
      }
      uVar13 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar13;
    } while (uVar13 != 10);
    pfStack_5110 = (fdb_kvs_handle *)0x11ce31;
    fVar2 = fdb_end_transaction(pfStack_5108,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0c3;
    pfStack_5110 = (fdb_kvs_handle *)0x11ce49;
    fdb_compact(pfStack_5108,"./mvcc_test3");
    pfStack_5110 = (fdb_kvs_handle *)0x11ce57;
    fVar2 = fdb_begin_transaction(pfStack_5108,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0c8;
    pcVar30 = "key%d";
    pfVar9 = (fdb_kvs_handle *)acStack_50f7;
    uVar13 = 0;
    do {
      pfStack_5110 = (fdb_kvs_handle *)0x11ce7c;
      sprintf((char *)pfVar9,"key%d",(ulong)uVar13);
      pfVar31 = pfStack_5100;
      pfStack_5110 = (fdb_kvs_handle *)0x11ce89;
      sVar6 = strlen((char *)pfVar9);
      pfStack_5110 = (fdb_kvs_handle *)0x11ce97;
      fVar2 = fdb_del_kv(pfVar31,pfVar9,sVar6);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0a5;
      uVar13 = uVar13 + 1;
    } while (uVar13 != 10);
    pfStack_5110 = (fdb_kvs_handle *)0x11ceb4;
    fVar2 = fdb_get_file_info(pfStack_5108,(fdb_file_info *)auStack_50a0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0cd;
    pcVar30 = (char *)((ulong)auStack_50a0._40_8_ / (ulong)uStack_5054);
    pfStack_5110 = (fdb_kvs_handle *)0x11cedc;
    fdb_close(pfStack_5108);
    pfStack_5110 = (fdb_kvs_handle *)0x11cee1;
    fdb_shutdown();
    pfStack_5110 = (fdb_kvs_handle *)0x11cf00;
    iVar4 = _disk_dump("./mvcc_test3",(ulong)uStack_5054 * (long)pcVar30,
                       (ulong)((uStack_5054 >> 2) + uStack_5054 * 2));
    if (iVar4 < 0) goto LAB_0011d0d2;
    pfStack_5110 = (fdb_kvs_handle *)0x11cf2a;
    iVar4 = _disk_dump("./mvcc_test2",((long)pcVar30 * 4 + 8) * (ulong)uStack_5054,
                       (ulong)(uStack_5054 >> 2));
    if (iVar4 < 0) goto LAB_0011d0d7;
    pfStack_5110 = (fdb_kvs_handle *)0x11cf49;
    fVar2 = fdb_open(&pfStack_5108,"./mvcc_test3",(fdb_config *)(auStack_50a0 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0dc;
    pcVar30 = (char *)&pfStack_50e8;
    pfStack_5110 = (fdb_kvs_handle *)0x11cf5e;
    fdb_get_default_kvs_config();
    pbStack_50b8 = pbStack_50d8;
    pfStack_50c8 = pfStack_50e8;
    pdStack_50c0 = pdStack_50e0;
    pfStack_5110 = (fdb_kvs_handle *)0x11cf7f;
    fVar2 = fdb_kvs_open_default(pfStack_5108,&pfStack_5100,(fdb_kvs_config *)&pfStack_50c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0e1;
    pfStack_5110 = (fdb_kvs_handle *)0x11cf95;
    fVar2 = fdb_begin_transaction(pfStack_5108,'\x03');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      uVar13 = 0;
      do {
        pfStack_5110 = (fdb_kvs_handle *)0x11cfba;
        sprintf(acStack_50f7,"key%d",(ulong)uVar13);
        pfVar31 = pfStack_5100;
        pfStack_5110 = (fdb_kvs_handle *)0x11cfc7;
        sVar6 = strlen(acStack_50f7);
        pfStack_5110 = (fdb_kvs_handle *)0x11cfd5;
        fVar2 = fdb_del_kv(pfVar31,acStack_50f7,sVar6);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0aa;
        uVar13 = uVar13 + 1;
      } while (uVar13 != 10);
      pfStack_5110 = (fdb_kvs_handle *)0x11cfed;
      fdb_abort_transaction(pfStack_5108);
      pfVar31 = (fdb_kvs_handle *)&pfStack_50e8;
      uVar13 = 0;
      while( true ) {
        pfStack_5110 = (fdb_kvs_handle *)0x11d014;
        sprintf(acStack_50f7,"key%d",(ulong)uVar13);
        pfVar9 = pfStack_5100;
        pfStack_5110 = (fdb_kvs_handle *)0x11d021;
        sVar6 = strlen(acStack_50f7);
        pfStack_5110 = (fdb_kvs_handle *)0x11d035;
        fVar2 = fdb_get_kv(pfVar9,acStack_50f7,sVar6,(void **)pfVar31,&sStack_50d0);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_5110 = (fdb_kvs_handle *)0x11d043;
        free(pfStack_50e8);
        uVar13 = uVar13 + 1;
        if (uVar13 == 10) {
          pfStack_5110 = (fdb_kvs_handle *)0x11d053;
          fdb_close(pfStack_5108);
          pfStack_5110 = (fdb_kvs_handle *)0x11d058;
          fdb_shutdown();
          pfStack_5110 = (fdb_kvs_handle *)0x11d05d;
          memleak_end();
          pcVar30 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar30 = "%s FAILED\n";
          }
          pfStack_5110 = (fdb_kvs_handle *)0x11d08e;
          iVar4 = fprintf(_stderr,pcVar30,"crash recover test");
          return iVar4;
        }
      }
LAB_0011d0af:
      pfVar9 = (fdb_kvs_handle *)acStack_50f7;
      pcVar30 = "key%d";
      pfStack_5110 = (fdb_kvs_handle *)0x11d0b4;
      tx_crash_recover_test();
      goto LAB_0011d0b4;
    }
  }
  else {
LAB_0011d0b4:
    pfStack_5110 = (fdb_kvs_handle *)0x11d0b9;
    tx_crash_recover_test();
LAB_0011d0b9:
    pfStack_5110 = (fdb_kvs_handle *)0x11d0be;
    tx_crash_recover_test();
LAB_0011d0be:
    pfStack_5110 = (fdb_kvs_handle *)0x11d0c3;
    tx_crash_recover_test();
LAB_0011d0c3:
    pfStack_5110 = (fdb_kvs_handle *)0x11d0c8;
    tx_crash_recover_test();
LAB_0011d0c8:
    pfStack_5110 = (fdb_kvs_handle *)0x11d0cd;
    tx_crash_recover_test();
LAB_0011d0cd:
    pfStack_5110 = (fdb_kvs_handle *)0x11d0d2;
    tx_crash_recover_test();
LAB_0011d0d2:
    pfStack_5110 = (fdb_kvs_handle *)0x11d0d7;
    tx_crash_recover_test();
LAB_0011d0d7:
    pfStack_5110 = (fdb_kvs_handle *)0x11d0dc;
    tx_crash_recover_test();
LAB_0011d0dc:
    pfStack_5110 = (fdb_kvs_handle *)0x11d0e1;
    tx_crash_recover_test();
LAB_0011d0e1:
    pfStack_5110 = (fdb_kvs_handle *)0x11d0e6;
    tx_crash_recover_test();
  }
  pfStack_5110 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_5120 = (fdb_config *)pcVar30;
  pfStack_5118 = pfVar9;
  pfStack_5110 = pfVar31;
  gettimeofday(&tStack_5240,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_5250 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_5260,"./mvcc_test1",&fStack_5218);
  fdb_kvs_open_default(pfStack_5260,&pfStack_5248,&fStack_5230);
  fdb_kvs_open(pfStack_5260,&pfStack_5268,"kv",&fStack_5230);
  fVar2 = fdb_set_kv(pfStack_5268,"a",1,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_5268,"b",1,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d304;
    fdb_commit(pfStack_5260,'\x01');
    fVar2 = fdb_snapshot_open(pfStack_5268,&pfStack_5270,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d30b;
    fVar2 = fdb_iterator_init(pfStack_5270,&pfStack_5258,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d310;
    fVar2 = fdb_kvs_close(pfStack_5270);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d315;
    fVar2 = fdb_kvs_close(pfStack_5268);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d31a;
    fVar2 = fdb_kvs_remove(pfStack_5260,"kv");
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d31f;
    fVar2 = fdb_iterator_get(pfStack_5258,&pfStack_5250);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d324;
    fdb_doc_free(pfStack_5250);
    fVar2 = fdb_iterator_close(pfStack_5258);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d329;
    fVar2 = fdb_kvs_close(pfStack_5270);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d32e;
    fVar2 = fdb_kvs_close(pfStack_5248);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_close(pfStack_5260);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar30 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar30 = "%s FAILED\n";
        }
        iVar4 = fprintf(_stderr,pcVar30,"drop kv other handle test");
        return iVar4;
      }
      goto LAB_0011d338;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d304:
    drop_kv_on_snap_iterator_test();
LAB_0011d30b:
    drop_kv_on_snap_iterator_test();
LAB_0011d310:
    drop_kv_on_snap_iterator_test();
LAB_0011d315:
    drop_kv_on_snap_iterator_test();
LAB_0011d31a:
    drop_kv_on_snap_iterator_test();
LAB_0011d31f:
    drop_kv_on_snap_iterator_test();
LAB_0011d324:
    drop_kv_on_snap_iterator_test();
LAB_0011d329:
    drop_kv_on_snap_iterator_test();
LAB_0011d32e:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d338:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return 0;
}

Assistant:

static fdb_compact_decision cb_snapshot(fdb_file_handle *fhandle,
        fdb_compaction_status status, const char *kv_name,
        fdb_doc *doc, uint64_t old_offset, uint64_t new_offset,
        void *ctx)
{
    struct cb_snapshot_args *args = (struct cb_snapshot_args *)ctx;
    TEST_INIT();

    if (--args->niterations >= 0) {
        TEST_CHK(!kv_name);
        if (status == FDB_CS_BEGIN) {
            // first verification
            _snapshot_check(args->handle, args->ndocs, args->nupdates);
            // update half docs
            _snapshot_update_docs(fhandle, args);
            // second verification
            _snapshot_check(args->handle, args->ndocs, args->nupdates);
        } else { // if (status == FDB_CS_END)
            // first verification
            _snapshot_check(args->handle, args->ndocs, args->nupdates);
            // update half docs
            _snapshot_update_docs(fhandle, args);
            // second verification
            _snapshot_check(args->handle, args->ndocs, args->nupdates);
        }
    }
    return 0;
}